

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  uint uVar74;
  Geometry *geometry;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  long lVar75;
  byte bVar76;
  float fVar77;
  float fVar78;
  float fVar125;
  float fVar126;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar84 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar128;
  float fVar131;
  float fVar132;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  float fVar133;
  float fVar134;
  undefined4 uVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  float fVar140;
  undefined1 auVar139 [64];
  undefined1 auVar142 [16];
  undefined8 uVar141;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar166;
  undefined1 auVar165 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  vint<16> mask;
  float old_t_1;
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  LinearSpace3fa *local_7f0;
  Primitive *local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint uStack_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  undefined1 local_6c0 [64];
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined4 local_5e0;
  int local_5dc;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  float local_580 [4];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar181 [64];
  
  PVar11 = prim[1];
  uVar68 = (ulong)(byte)PVar11;
  lVar24 = uVar68 * 0x25;
  fVar150 = *(float *)(prim + lVar24 + 0x12);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar82 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar83 = vsubps_avx(auVar79,*(undefined1 (*) [16])(prim + lVar24 + 6));
  fVar149 = fVar150 * auVar83._0_4_;
  fVar133 = fVar150 * auVar82._0_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar68 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar68 * 5 + 6);
  auVar88 = vpmovsxbd_avx2(auVar80);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar68 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar81);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar68 * 0xf + 6);
  auVar90 = vpmovsxbd_avx2(auVar6);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar94 = vpmovsxbd_avx2(auVar192);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar92 = vcvtdq2ps_avx(auVar94);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar68 + 6);
  auVar93 = vpmovsxbd_avx2(auVar7);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar68 * 0x1a + 6);
  auVar100 = vpmovsxbd_avx2(auVar8);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar68 * 0x1b + 6);
  auVar99 = vpmovsxbd_avx2(auVar9);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar68 * 0x1c + 6);
  auVar87 = vpmovsxbd_avx2(auVar10);
  auVar95 = vcvtdq2ps_avx(auVar87);
  auVar163._4_4_ = fVar133;
  auVar163._0_4_ = fVar133;
  auVar163._8_4_ = fVar133;
  auVar163._12_4_ = fVar133;
  auVar163._16_4_ = fVar133;
  auVar163._20_4_ = fVar133;
  auVar163._24_4_ = fVar133;
  auVar163._28_4_ = fVar133;
  auVar183._8_4_ = 1;
  auVar183._0_8_ = 0x100000001;
  auVar183._12_4_ = 1;
  auVar183._16_4_ = 1;
  auVar183._20_4_ = 1;
  auVar183._24_4_ = 1;
  auVar183._28_4_ = 1;
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = ZEXT1632(CONCAT412(fVar150 * auVar82._12_4_,
                               CONCAT48(fVar150 * auVar82._8_4_,
                                        CONCAT44(fVar150 * auVar82._4_4_,fVar133))));
  auVar96 = vpermps_avx2(auVar183,auVar97);
  auVar86 = vpermps_avx512vl(auVar85,auVar97);
  fVar134 = auVar86._0_4_;
  fVar140 = auVar86._4_4_;
  auVar97._4_4_ = fVar140 * auVar89._4_4_;
  auVar97._0_4_ = fVar134 * auVar89._0_4_;
  fVar164 = auVar86._8_4_;
  auVar97._8_4_ = fVar164 * auVar89._8_4_;
  fVar166 = auVar86._12_4_;
  auVar97._12_4_ = fVar166 * auVar89._12_4_;
  fVar77 = auVar86._16_4_;
  auVar97._16_4_ = fVar77 * auVar89._16_4_;
  fVar78 = auVar86._20_4_;
  auVar97._20_4_ = fVar78 * auVar89._20_4_;
  fVar125 = auVar86._24_4_;
  auVar97._24_4_ = fVar125 * auVar89._24_4_;
  auVar97._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar93._4_4_ * fVar140;
  auVar94._0_4_ = auVar93._0_4_ * fVar134;
  auVar94._8_4_ = auVar93._8_4_ * fVar164;
  auVar94._12_4_ = auVar93._12_4_ * fVar166;
  auVar94._16_4_ = auVar93._16_4_ * fVar77;
  auVar94._20_4_ = auVar93._20_4_ * fVar78;
  auVar94._24_4_ = auVar93._24_4_ * fVar125;
  auVar94._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar95._4_4_ * fVar140;
  auVar87._0_4_ = auVar95._0_4_ * fVar134;
  auVar87._8_4_ = auVar95._8_4_ * fVar164;
  auVar87._12_4_ = auVar95._12_4_ * fVar166;
  auVar87._16_4_ = auVar95._16_4_ * fVar77;
  auVar87._20_4_ = auVar95._20_4_ * fVar78;
  auVar87._24_4_ = auVar95._24_4_ * fVar125;
  auVar87._28_4_ = auVar86._28_4_;
  auVar79 = vfmadd231ps_fma(auVar97,auVar96,auVar88);
  auVar80 = vfmadd231ps_fma(auVar94,auVar96,auVar92);
  auVar81 = vfmadd231ps_fma(auVar87,auVar99,auVar96);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar163,auVar91);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar163,auVar90);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar100,auVar163);
  auVar178._4_4_ = fVar149;
  auVar178._0_4_ = fVar149;
  auVar178._8_4_ = fVar149;
  auVar178._12_4_ = fVar149;
  auVar178._16_4_ = fVar149;
  auVar178._20_4_ = fVar149;
  auVar178._24_4_ = fVar149;
  auVar178._28_4_ = fVar149;
  auVar87 = ZEXT1632(CONCAT412(fVar150 * auVar83._12_4_,
                               CONCAT48(fVar150 * auVar83._8_4_,
                                        CONCAT44(fVar150 * auVar83._4_4_,fVar149))));
  auVar94 = vpermps_avx2(auVar183,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  fVar150 = auVar87._0_4_;
  fVar134 = auVar87._4_4_;
  auVar96._4_4_ = fVar134 * auVar89._4_4_;
  auVar96._0_4_ = fVar150 * auVar89._0_4_;
  fVar140 = auVar87._8_4_;
  auVar96._8_4_ = fVar140 * auVar89._8_4_;
  fVar164 = auVar87._12_4_;
  auVar96._12_4_ = fVar164 * auVar89._12_4_;
  fVar166 = auVar87._16_4_;
  auVar96._16_4_ = fVar166 * auVar89._16_4_;
  fVar77 = auVar87._20_4_;
  auVar96._20_4_ = fVar77 * auVar89._20_4_;
  fVar78 = auVar87._24_4_;
  auVar96._24_4_ = fVar78 * auVar89._24_4_;
  auVar96._28_4_ = fVar133;
  auVar85._4_4_ = auVar93._4_4_ * fVar134;
  auVar85._0_4_ = auVar93._0_4_ * fVar150;
  auVar85._8_4_ = auVar93._8_4_ * fVar140;
  auVar85._12_4_ = auVar93._12_4_ * fVar164;
  auVar85._16_4_ = auVar93._16_4_ * fVar166;
  auVar85._20_4_ = auVar93._20_4_ * fVar77;
  auVar85._24_4_ = auVar93._24_4_ * fVar78;
  auVar85._28_4_ = auVar89._28_4_;
  auVar93._4_4_ = auVar95._4_4_ * fVar134;
  auVar93._0_4_ = auVar95._0_4_ * fVar150;
  auVar93._8_4_ = auVar95._8_4_ * fVar140;
  auVar93._12_4_ = auVar95._12_4_ * fVar164;
  auVar93._16_4_ = auVar95._16_4_ * fVar166;
  auVar93._20_4_ = auVar95._20_4_ * fVar77;
  auVar93._24_4_ = auVar95._24_4_ * fVar78;
  auVar93._28_4_ = auVar87._28_4_;
  auVar6 = vfmadd231ps_fma(auVar96,auVar94,auVar88);
  auVar192 = vfmadd231ps_fma(auVar85,auVar94,auVar92);
  auVar7 = vfmadd231ps_fma(auVar93,auVar94,auVar99);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar178,auVar91);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar178,auVar90);
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar170._16_4_ = 0x7fffffff;
  auVar170._20_4_ = 0x7fffffff;
  auVar170._24_4_ = 0x7fffffff;
  auVar170._28_4_ = 0x7fffffff;
  auVar142 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar178,auVar100);
  auVar91 = vandps_avx(auVar170,ZEXT1632(auVar79));
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  auVar167._16_4_ = 0x219392ef;
  auVar167._20_4_ = 0x219392ef;
  auVar167._24_4_ = 0x219392ef;
  auVar167._28_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar91,auVar167,1);
  bVar17 = (bool)((byte)uVar70 & 1);
  auVar86._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar79._0_4_;
  bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar79._4_4_;
  bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar79._8_4_;
  bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar79._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(auVar170,ZEXT1632(auVar80));
  uVar70 = vcmpps_avx512vl(auVar91,auVar167,1);
  bVar17 = (bool)((byte)uVar70 & 1);
  auVar98._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar80._0_4_;
  bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar80._4_4_;
  bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar80._8_4_;
  bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar80._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(auVar170,ZEXT1632(auVar81));
  uVar70 = vcmpps_avx512vl(auVar91,auVar167,1);
  bVar17 = (bool)((byte)uVar70 & 1);
  auVar91._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._0_4_;
  bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._4_4_;
  bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._8_4_;
  bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar88 = vrcp14ps_avx512vl(auVar86);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar90 = vfnmadd213ps_avx512vl(auVar86,auVar88,auVar89);
  auVar79 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar98);
  auVar90 = vfnmadd213ps_avx512vl(auVar98,auVar88,auVar89);
  auVar80 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar91);
  auVar91 = vfnmadd213ps_avx512vl(auVar91,auVar88,auVar89);
  auVar81 = vfmadd132ps_fma(auVar91,auVar88,auVar88);
  fVar150 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar165._4_4_ = fVar150;
  auVar165._0_4_ = fVar150;
  auVar165._8_4_ = fVar150;
  auVar165._12_4_ = fVar150;
  auVar165._16_4_ = fVar150;
  auVar165._20_4_ = fVar150;
  auVar165._24_4_ = fVar150;
  auVar165._28_4_ = fVar150;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0xb + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar88,auVar165,auVar91);
  auVar91 = vcvtdq2ps_avx(auVar89);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0xd + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar192 = vfmadd213ps_fma(auVar88,auVar165,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x12 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar70 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 2 + uVar70 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar7 = vfmadd213ps_fma(auVar88,auVar165,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x18 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar8 = vfmadd213ps_fma(auVar88,auVar165,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x1d + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 + (ulong)(byte)PVar11 * 0x20 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar9 = vfmadd213ps_fma(auVar88,auVar165,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar11 * 0x20 - uVar68) + 6))
  ;
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x23 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar10 = vfmadd213ps_fma(auVar88,auVar165,auVar91);
  auVar91 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar82));
  auVar100._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar100._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar100._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar100._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar100._16_4_ = auVar91._16_4_ * 0.0;
  auVar100._20_4_ = auVar91._20_4_ * 0.0;
  auVar100._24_4_ = auVar91._24_4_ * 0.0;
  auVar100._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar82));
  auVar147._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar147._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar147._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar147._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar147._16_4_ = auVar91._16_4_ * 0.0;
  auVar147._20_4_ = auVar91._20_4_ * 0.0;
  auVar147._24_4_ = auVar91._24_4_ * 0.0;
  auVar147._28_4_ = 0;
  auVar91 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar83));
  auVar99._4_4_ = auVar80._4_4_ * auVar91._4_4_;
  auVar99._0_4_ = auVar80._0_4_ * auVar91._0_4_;
  auVar99._8_4_ = auVar80._8_4_ * auVar91._8_4_;
  auVar99._12_4_ = auVar80._12_4_ * auVar91._12_4_;
  auVar99._16_4_ = auVar91._16_4_ * 0.0;
  auVar99._20_4_ = auVar91._20_4_ * 0.0;
  auVar99._24_4_ = auVar91._24_4_ * 0.0;
  auVar99._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar83));
  auVar143._0_4_ = auVar80._0_4_ * auVar91._0_4_;
  auVar143._4_4_ = auVar80._4_4_ * auVar91._4_4_;
  auVar143._8_4_ = auVar80._8_4_ * auVar91._8_4_;
  auVar143._12_4_ = auVar80._12_4_ * auVar91._12_4_;
  auVar143._16_4_ = auVar91._16_4_ * 0.0;
  auVar143._20_4_ = auVar91._20_4_ * 0.0;
  auVar143._24_4_ = auVar91._24_4_ * 0.0;
  auVar143._28_4_ = 0;
  auVar91 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar142));
  auVar95._4_4_ = auVar81._4_4_ * auVar91._4_4_;
  auVar95._0_4_ = auVar81._0_4_ * auVar91._0_4_;
  auVar95._8_4_ = auVar81._8_4_ * auVar91._8_4_;
  auVar95._12_4_ = auVar81._12_4_ * auVar91._12_4_;
  auVar95._16_4_ = auVar91._16_4_ * 0.0;
  auVar95._20_4_ = auVar91._20_4_ * 0.0;
  auVar95._24_4_ = auVar91._24_4_ * 0.0;
  auVar95._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar142));
  auVar112._0_4_ = auVar81._0_4_ * auVar91._0_4_;
  auVar112._4_4_ = auVar81._4_4_ * auVar91._4_4_;
  auVar112._8_4_ = auVar81._8_4_ * auVar91._8_4_;
  auVar112._12_4_ = auVar81._12_4_ * auVar91._12_4_;
  auVar112._16_4_ = auVar91._16_4_ * 0.0;
  auVar112._20_4_ = auVar91._20_4_ * 0.0;
  auVar112._24_4_ = auVar91._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar100,auVar147);
  auVar88 = vpminsd_avx2(auVar99,auVar143);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88 = vpminsd_avx2(auVar95,auVar112);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar89._4_4_ = uVar135;
  auVar89._0_4_ = uVar135;
  auVar89._8_4_ = uVar135;
  auVar89._12_4_ = uVar135;
  auVar89._16_4_ = uVar135;
  auVar89._20_4_ = uVar135;
  auVar89._24_4_ = uVar135;
  auVar89._28_4_ = uVar135;
  auVar88 = vmaxps_avx512vl(auVar88,auVar89);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  auVar88._16_4_ = 0x3f7ffffa;
  auVar88._20_4_ = 0x3f7ffffa;
  auVar88._24_4_ = 0x3f7ffffa;
  auVar88._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar91,auVar88);
  auVar91 = vpmaxsd_avx2(auVar100,auVar147);
  auVar88 = vpmaxsd_avx2(auVar99,auVar143);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar88 = vpmaxsd_avx2(auVar95,auVar112);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar90._4_4_ = uVar135;
  auVar90._0_4_ = uVar135;
  auVar90._8_4_ = uVar135;
  auVar90._12_4_ = uVar135;
  auVar90._16_4_ = uVar135;
  auVar90._20_4_ = uVar135;
  auVar90._24_4_ = uVar135;
  auVar90._28_4_ = uVar135;
  auVar88 = vminps_avx512vl(auVar88,auVar90);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar92);
  auVar88 = vpbroadcastd_avx512vl();
  uVar23 = vpcmpgtd_avx512vl(auVar88,_DAT_01fe9900);
  uVar141 = vcmpps_avx512vl(local_320,auVar91,2);
  if ((byte)((byte)uVar141 & (byte)uVar23) == 0) {
    bVar76 = 0;
  }
  else {
    uVar70 = (ulong)(byte)((byte)uVar141 & (byte)uVar23);
    local_7f0 = pre->ray_space + k;
    auVar139 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar139);
    local_7e8 = prim;
    do {
      lVar24 = 0;
      for (uVar68 = uVar70; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar12 = *(uint *)(local_7e8 + 2);
      pGVar14 = (context->scene->geometries).items[uVar12].ptr;
      local_480._0_8_ = CONCAT44(0,*(uint *)(local_7e8 + lVar24 * 4 + 6));
      uVar68 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               CONCAT44(0,*(uint *)(local_7e8 + lVar24 * 4 + 6)) *
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar150 = (pGVar14->time_range).lower;
      fVar150 = pGVar14->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar150) /
                ((pGVar14->time_range).upper - fVar150));
      auVar79 = vroundss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),9);
      auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
      auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
      fVar150 = fVar150 - auVar79._0_4_;
      _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar71 = (long)(int)auVar79._0_4_ * 0x38;
      lVar24 = *(long *)(_Var15 + 0x10 + lVar71);
      lVar75 = *(long *)(_Var15 + 0x38 + lVar71);
      lVar69 = *(long *)(_Var15 + 0x48 + lVar71);
      auVar83._4_4_ = fVar150;
      auVar83._0_4_ = fVar150;
      auVar83._8_4_ = fVar150;
      auVar83._12_4_ = fVar150;
      pfVar3 = (float *)(lVar75 + uVar68 * lVar69);
      auVar169._0_4_ = fVar150 * *pfVar3;
      auVar169._4_4_ = fVar150 * pfVar3[1];
      auVar169._8_4_ = fVar150 * pfVar3[2];
      auVar169._12_4_ = fVar150 * pfVar3[3];
      pfVar3 = (float *)(lVar75 + (uVar68 + 1) * lVar69);
      auVar172._0_4_ = fVar150 * *pfVar3;
      auVar172._4_4_ = fVar150 * pfVar3[1];
      auVar172._8_4_ = fVar150 * pfVar3[2];
      auVar172._12_4_ = fVar150 * pfVar3[3];
      uVar72 = (uVar68 + 2) * lVar69;
      auVar79 = vmulps_avx512vl(auVar83,*(undefined1 (*) [16])(lVar75 + uVar72));
      auVar80 = vmulps_avx512vl(auVar83,*(undefined1 (*) [16])(lVar75 + lVar69 * (uVar68 + 3)));
      lVar75 = *(long *)(_Var15 + lVar71);
      fVar150 = 1.0 - fVar150;
      auVar82._4_4_ = fVar150;
      auVar82._0_4_ = fVar150;
      auVar82._8_4_ = fVar150;
      auVar82._12_4_ = fVar150;
      local_870 = vfmadd231ps_fma(auVar169,auVar82,*(undefined1 (*) [16])(lVar75 + lVar24 * uVar68))
      ;
      local_880 = vfmadd231ps_fma(auVar172,auVar82,
                                  *(undefined1 (*) [16])(lVar75 + lVar24 * (uVar68 + 1)));
      local_890 = vfmadd231ps_avx512vl
                            (auVar79,auVar82,*(undefined1 (*) [16])(lVar75 + lVar24 * (uVar68 + 2)))
      ;
      _local_710 = vfmadd231ps_avx512vl
                             (auVar80,auVar82,*(undefined1 (*) [16])(lVar75 + lVar24 * (uVar68 + 3))
                             );
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      lVar24 = (long)iVar13 * 0x44;
      auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar81 = vsubps_avx(local_870,auVar79);
      uVar135 = auVar81._0_4_;
      auVar84._4_4_ = uVar135;
      auVar84._0_4_ = uVar135;
      auVar84._8_4_ = uVar135;
      auVar84._12_4_ = uVar135;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      aVar4 = (local_7f0->vx).field_0;
      aVar5 = (local_7f0->vy).field_0;
      fVar150 = (local_7f0->vz).field_0.m128[0];
      fVar133 = *(float *)((long)&(local_7f0->vz).field_0 + 4);
      fVar134 = *(float *)((long)&(local_7f0->vz).field_0 + 8);
      fVar140 = *(float *)((long)&(local_7f0->vz).field_0 + 0xc);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar174._0_4_ = fVar150 * auVar81._0_4_;
      auVar174._4_4_ = fVar133 * auVar81._4_4_;
      auVar174._8_4_ = fVar134 * auVar81._8_4_;
      auVar174._12_4_ = fVar140 * auVar81._12_4_;
      auVar80 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar80);
      auVar6 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar84);
      auVar81 = vsubps_avx(local_880,auVar79);
      uVar135 = auVar81._0_4_;
      auVar145._4_4_ = uVar135;
      auVar145._0_4_ = uVar135;
      auVar145._8_4_ = uVar135;
      auVar145._12_4_ = uVar135;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar175._0_4_ = fVar150 * auVar81._0_4_;
      auVar175._4_4_ = fVar133 * auVar81._4_4_;
      auVar175._8_4_ = fVar134 * auVar81._8_4_;
      auVar175._12_4_ = fVar140 * auVar81._12_4_;
      auVar80 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar5,auVar80);
      auVar192 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar145);
      auVar81 = vsubps_avx512vl(local_890,auVar79);
      uVar135 = auVar81._0_4_;
      auVar146._4_4_ = uVar135;
      auVar146._0_4_ = uVar135;
      auVar146._8_4_ = uVar135;
      auVar146._12_4_ = uVar135;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar176._0_4_ = fVar150 * auVar81._0_4_;
      auVar176._4_4_ = fVar133 * auVar81._4_4_;
      auVar176._8_4_ = fVar134 * auVar81._8_4_;
      auVar176._12_4_ = fVar140 * auVar81._12_4_;
      auVar80 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar80);
      auVar81 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar146);
      auVar80 = vsubps_avx512vl(_local_710,auVar79);
      uVar135 = auVar80._0_4_;
      auVar142._4_4_ = uVar135;
      auVar142._0_4_ = uVar135;
      auVar142._8_4_ = uVar135;
      auVar142._12_4_ = uVar135;
      auVar79 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar182._0_4_ = fVar150 * auVar80._0_4_;
      auVar182._4_4_ = fVar133 * auVar80._4_4_;
      auVar182._8_4_ = fVar134 * auVar80._8_4_;
      auVar182._12_4_ = fVar140 * auVar80._12_4_;
      auVar79 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar5,auVar79);
      auVar7 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar142);
      auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      uVar135 = auVar6._0_4_;
      local_780._4_4_ = uVar135;
      local_780._0_4_ = uVar135;
      local_780._8_4_ = uVar135;
      local_780._12_4_ = uVar135;
      local_780._16_4_ = uVar135;
      local_780._20_4_ = uVar135;
      local_780._24_4_ = uVar135;
      local_780._28_4_ = uVar135;
      auVar88 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      auVar138._8_4_ = 1;
      auVar138._0_8_ = 0x100000001;
      auVar138._12_4_ = 1;
      auVar138._16_4_ = 1;
      auVar138._20_4_ = 1;
      auVar138._24_4_ = 1;
      auVar138._28_4_ = 1;
      local_740 = vpermps_avx2(auVar138,ZEXT1632(auVar6));
      local_7a0 = vbroadcastss_avx512vl(auVar192);
      local_8c0 = vpermps_avx2(auVar138,ZEXT1632(auVar192));
      auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      local_8e0 = vbroadcastss_avx512vl(auVar81);
      local_860 = vpermps_avx512vl(auVar138,ZEXT1632(auVar81));
      auVar139 = ZEXT3264(local_860);
      auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_820 = vbroadcastss_avx512vl(auVar7);
      auVar195 = ZEXT3264(local_820);
      local_840 = vpermps_avx512vl(auVar138,ZEXT1632(auVar7));
      auVar196 = ZEXT3264(local_840);
      auVar92 = vmulps_avx512vl(local_820,auVar90);
      auVar93 = vmulps_avx512vl(local_840,auVar90);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_8e0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_860);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_7a0);
      auVar79 = vfmadd231ps_fma(auVar93,auVar88,local_8c0);
      auVar94 = vfmadd231ps_avx512vl(auVar92,auVar91,local_780);
      auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar91,local_740);
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar95 = vmulps_avx512vl(local_820,auVar99);
      auVar96 = vmulps_avx512vl(local_840,auVar99);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_8e0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_860);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_7a0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_8c0);
      auVar8 = vfmadd231ps_fma(auVar95,auVar92,local_780);
      auVar9 = vfmadd231ps_fma(auVar96,auVar92,local_740);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar8),auVar94);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar9),auVar87);
      auVar95 = vmulps_avx512vl(auVar87,auVar96);
      auVar85 = vmulps_avx512vl(auVar94,auVar97);
      auVar95 = vsubps_avx512vl(auVar95,auVar85);
      auVar79 = vshufps_avx(local_870,local_870,0xff);
      uVar141 = auVar79._0_8_;
      local_340._8_8_ = uVar141;
      local_340._0_8_ = uVar141;
      local_340._16_8_ = uVar141;
      local_340._24_8_ = uVar141;
      auVar79 = vshufps_avx(local_880,local_880,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar79);
      auVar79 = vshufps_avx512vl(local_890,local_890,0xff);
      local_380 = vbroadcastsd_avx512vl(auVar79);
      auVar79 = vshufps_avx512vl(_local_710,_local_710,0xff);
      uVar141 = auVar79._0_8_;
      register0x000012c8 = uVar141;
      local_3a0 = uVar141;
      register0x000012d0 = uVar141;
      register0x000012d8 = uVar141;
      auVar85 = vmulps_avx512vl(_local_3a0,auVar90);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar89,local_380);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,local_360);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,local_340);
      auVar86 = vmulps_avx512vl(_local_3a0,auVar99);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,local_380);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar93,local_360);
      auVar10 = vfmadd231ps_fma(auVar86,auVar92,local_340);
      auVar86 = vmulps_avx512vl(auVar97,auVar97);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar96,auVar96);
      auVar98 = vmaxps_avx512vl(auVar85,ZEXT1632(auVar10));
      auVar98 = vmulps_avx512vl(auVar98,auVar98);
      auVar86 = vmulps_avx512vl(auVar98,auVar86);
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      uVar141 = vcmpps_avx512vl(auVar95,auVar86,2);
      auVar79 = vblendps_avx(auVar6,local_870,8);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar80 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vblendps_avx(auVar192,local_880,8);
      auVar79 = vandps_avx512vl(auVar79,auVar82);
      auVar80 = vmaxps_avx(auVar80,auVar79);
      auVar79 = vblendps_avx(auVar81,local_890,8);
      auVar83 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vblendps_avx(auVar7,_local_710,8);
      auVar79 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vmaxps_avx(auVar83,auVar79);
      auVar79 = vmaxps_avx(auVar80,auVar79);
      auVar80 = vmovshdup_avx(auVar79);
      auVar80 = vmaxss_avx(auVar80,auVar79);
      auVar79 = vshufpd_avx(auVar79,auVar79,1);
      auVar79 = vmaxss_avx(auVar79,auVar80);
      auVar80 = vcvtsi2ss_avx512f(local_890,iVar13);
      local_4c0._0_16_ = auVar80;
      auVar171._0_4_ = auVar80._0_4_;
      auVar171._4_4_ = auVar171._0_4_;
      auVar171._8_4_ = auVar171._0_4_;
      auVar171._12_4_ = auVar171._0_4_;
      auVar171._16_4_ = auVar171._0_4_;
      auVar171._20_4_ = auVar171._0_4_;
      auVar171._24_4_ = auVar171._0_4_;
      auVar171._28_4_ = auVar171._0_4_;
      uVar23 = vcmpps_avx512vl(auVar171,_DAT_01faff40,0xe);
      bVar76 = (byte)uVar141 & (byte)uVar23;
      auVar79 = vmulss_avx512f(auVar79,ZEXT416(0x35000000));
      auVar148._8_4_ = 2;
      auVar148._0_8_ = 0x200000002;
      auVar148._12_4_ = 2;
      auVar148._16_4_ = 2;
      auVar148._20_4_ = 2;
      auVar148._24_4_ = 2;
      auVar148._28_4_ = 2;
      local_3c0 = vpermps_avx512vl(auVar148,ZEXT1632(auVar6));
      local_3e0 = vpermps_avx512vl(auVar148,ZEXT1632(auVar192));
      local_400 = vpermps_avx512vl(auVar148,ZEXT1632(auVar81));
      auVar95 = vpermps_avx2(auVar148,ZEXT1632(auVar7));
      uVar74 = *(uint *)(ray + k * 4 + 0xc0);
      local_660 = auVar79._0_4_;
      uStack_65c = auVar79._4_4_;
      uStack_658 = auVar79._8_4_;
      uStack_654 = auVar79._12_4_;
      auVar80 = auVar97._0_16_;
      if (bVar76 == 0) {
        uVar72 = 0;
        auVar79 = vxorps_avx512vl(auVar80,auVar80);
        auVar193 = ZEXT1664(auVar79);
        auVar189 = ZEXT3264(local_780);
        auVar190 = ZEXT3264(local_740);
        auVar191 = ZEXT3264(local_7a0);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar194 = ZEXT3264(auVar91);
        auVar188 = ZEXT3264(local_8c0);
        auVar187 = ZEXT3264(local_8e0);
      }
      else {
        local_7e0._0_16_ = ZEXT416(uVar74);
        auVar99 = vmulps_avx512vl(auVar95,auVar99);
        auVar100 = vfmadd213ps_avx512vl(auVar100,local_400,auVar99);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_3e0,auVar100);
        auVar93 = vfmadd213ps_avx512vl(auVar92,local_3c0,auVar93);
        auVar90 = vmulps_avx512vl(auVar95,auVar90);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_400,auVar90);
        auVar100 = vfmadd213ps_avx512vl(auVar88,local_3e0,auVar89);
        auVar88 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1f9c);
        auVar100 = vfmadd213ps_avx512vl(auVar91,local_3c0,auVar100);
        auVar91 = vmulps_avx512vl(local_820,auVar92);
        auVar99 = vmulps_avx512vl(local_840,auVar92);
        auVar177._0_4_ = auVar95._0_4_ * auVar92._0_4_;
        auVar177._4_4_ = auVar95._4_4_ * auVar92._4_4_;
        auVar177._8_4_ = auVar95._8_4_ * auVar92._8_4_;
        auVar177._12_4_ = auVar95._12_4_ * auVar92._12_4_;
        auVar177._16_4_ = auVar95._16_4_ * auVar92._16_4_;
        auVar177._20_4_ = auVar95._20_4_ * auVar92._20_4_;
        auVar177._24_4_ = auVar95._24_4_ * auVar92._24_4_;
        auVar177._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar90,local_8e0);
        auVar92 = vfmadd231ps_avx512vl(auVar99,auVar90,local_860);
        auVar90 = vfmadd231ps_avx512vl(auVar177,local_400,auVar90);
        auVar81 = vfmadd231ps_fma(auVar91,auVar89,local_7a0);
        auVar188 = ZEXT3264(local_8c0);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar89,local_8c0);
        auVar92 = vfmadd231ps_avx512vl(auVar90,local_3e0,auVar89);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar88,local_780);
        auVar86 = vfmadd231ps_avx512vl(auVar91,auVar88,local_740);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar89 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar90 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1f9c);
        auVar92 = vfmadd231ps_avx512vl(auVar92,local_3c0,auVar88);
        auVar88 = vmulps_avx512vl(local_820,auVar90);
        auVar98 = vmulps_avx512vl(local_840,auVar90);
        auVar30._4_4_ = auVar95._4_4_ * auVar90._4_4_;
        auVar30._0_4_ = auVar95._0_4_ * auVar90._0_4_;
        auVar30._8_4_ = auVar95._8_4_ * auVar90._8_4_;
        auVar30._12_4_ = auVar95._12_4_ * auVar90._12_4_;
        auVar30._16_4_ = auVar95._16_4_ * auVar90._16_4_;
        auVar30._20_4_ = auVar95._20_4_ * auVar90._20_4_;
        auVar30._24_4_ = auVar95._24_4_ * auVar90._24_4_;
        auVar30._28_4_ = auVar90._28_4_;
        auVar90 = vfmadd231ps_avx512vl(auVar88,auVar89,local_8e0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,local_860);
        auVar89 = vfmadd231ps_avx512vl(auVar30,local_400,auVar89);
        auVar88 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,local_7a0);
        auVar191 = ZEXT3264(local_7a0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,local_8c0);
        auVar88 = vfmadd231ps_avx512vl(auVar89,local_3e0,auVar88);
        auVar89 = vfmadd231ps_avx512vl(auVar90,auVar91,local_780);
        auVar90 = vfmadd231ps_avx512vl(auVar98,auVar91,local_740);
        auVar98 = vfmadd231ps_avx512vl(auVar88,local_3c0,auVar91);
        auVar184._8_4_ = 0x7fffffff;
        auVar184._0_8_ = 0x7fffffff7fffffff;
        auVar184._12_4_ = 0x7fffffff;
        auVar184._16_4_ = 0x7fffffff;
        auVar184._20_4_ = 0x7fffffff;
        auVar184._24_4_ = 0x7fffffff;
        auVar184._28_4_ = 0x7fffffff;
        auVar91 = vandps_avx(auVar99,auVar184);
        auVar88 = vandps_avx(auVar86,auVar184);
        auVar88 = vmaxps_avx(auVar91,auVar88);
        auVar91 = vandps_avx(auVar92,auVar184);
        auVar91 = vmaxps_avx(auVar88,auVar91);
        auVar92 = vbroadcastss_avx512vl(auVar79);
        uVar68 = vcmpps_avx512vl(auVar91,auVar92,1);
        bVar17 = (bool)((byte)uVar68 & 1);
        auVar101._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar99._0_4_);
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar99._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar99._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar99._12_4_);
        bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar99._16_4_);
        bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar99._20_4_);
        bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar99._24_4_);
        bVar17 = SUB81(uVar68 >> 7,0);
        auVar101._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar99._28_4_;
        bVar17 = (bool)((byte)uVar68 & 1);
        auVar102._0_4_ = (float)((uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar86._0_4_);
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar86._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar86._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar86._12_4_);
        bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar86._16_4_);
        bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar86._20_4_);
        bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar86._24_4_);
        bVar17 = SUB81(uVar68 >> 7,0);
        auVar102._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar86._28_4_;
        auVar91 = vandps_avx(auVar184,auVar89);
        auVar88 = vandps_avx(auVar90,auVar184);
        auVar88 = vmaxps_avx(auVar91,auVar88);
        auVar91 = vandps_avx(auVar98,auVar184);
        auVar91 = vmaxps_avx(auVar88,auVar91);
        uVar68 = vcmpps_avx512vl(auVar91,auVar92,1);
        bVar17 = (bool)((byte)uVar68 & 1);
        auVar103._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar89._0_4_);
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar89._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar89._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar89._12_4_);
        bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar89._16_4_);
        bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar89._20_4_);
        bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar89._24_4_);
        bVar17 = SUB81(uVar68 >> 7,0);
        auVar103._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar89._28_4_;
        bVar17 = (bool)((byte)uVar68 & 1);
        auVar104._0_4_ = (float)((uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar90._0_4_);
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar90._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar90._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar90._12_4_);
        bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar90._16_4_);
        bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar90._20_4_);
        bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar90._24_4_);
        bVar17 = SUB81(uVar68 >> 7,0);
        auVar104._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar90._28_4_;
        auVar84 = vxorps_avx512vl(auVar80,auVar80);
        auVar193 = ZEXT1664(auVar84);
        auVar91 = vfmadd213ps_avx512vl(auVar101,auVar101,ZEXT1632(auVar84));
        auVar79 = vfmadd231ps_fma(auVar91,auVar102,auVar102);
        auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
        fVar150 = auVar91._0_4_;
        fVar133 = auVar91._4_4_;
        fVar134 = auVar91._8_4_;
        fVar140 = auVar91._12_4_;
        fVar164 = auVar91._16_4_;
        fVar166 = auVar91._20_4_;
        fVar77 = auVar91._24_4_;
        auVar31._4_4_ = fVar133 * fVar133 * fVar133 * auVar79._4_4_ * -0.5;
        auVar31._0_4_ = fVar150 * fVar150 * fVar150 * auVar79._0_4_ * -0.5;
        auVar31._8_4_ = fVar134 * fVar134 * fVar134 * auVar79._8_4_ * -0.5;
        auVar31._12_4_ = fVar140 * fVar140 * fVar140 * auVar79._12_4_ * -0.5;
        auVar31._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar31._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar31._24_4_ = fVar77 * fVar77 * fVar77 * -0.0;
        auVar31._28_4_ = auVar98._28_4_;
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar91 = vfmadd231ps_avx512vl(auVar31,auVar88,auVar91);
        auVar32._4_4_ = auVar102._4_4_ * auVar91._4_4_;
        auVar32._0_4_ = auVar102._0_4_ * auVar91._0_4_;
        auVar32._8_4_ = auVar102._8_4_ * auVar91._8_4_;
        auVar32._12_4_ = auVar102._12_4_ * auVar91._12_4_;
        auVar32._16_4_ = auVar102._16_4_ * auVar91._16_4_;
        auVar32._20_4_ = auVar102._20_4_ * auVar91._20_4_;
        auVar32._24_4_ = auVar102._24_4_ * auVar91._24_4_;
        auVar32._28_4_ = 0;
        auVar33._4_4_ = auVar91._4_4_ * -auVar101._4_4_;
        auVar33._0_4_ = auVar91._0_4_ * -auVar101._0_4_;
        auVar33._8_4_ = auVar91._8_4_ * -auVar101._8_4_;
        auVar33._12_4_ = auVar91._12_4_ * -auVar101._12_4_;
        auVar33._16_4_ = auVar91._16_4_ * -auVar101._16_4_;
        auVar33._20_4_ = auVar91._20_4_ * -auVar101._20_4_;
        auVar33._24_4_ = auVar91._24_4_ * -auVar101._24_4_;
        auVar33._28_4_ = auVar102._28_4_;
        auVar91 = vmulps_avx512vl(auVar91,ZEXT1632(auVar84));
        auVar96 = ZEXT1632(auVar84);
        auVar89 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar96);
        auVar79 = vfmadd231ps_fma(auVar89,auVar104,auVar104);
        auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
        fVar150 = auVar89._0_4_;
        fVar133 = auVar89._4_4_;
        fVar134 = auVar89._8_4_;
        fVar140 = auVar89._12_4_;
        fVar164 = auVar89._16_4_;
        fVar166 = auVar89._20_4_;
        fVar77 = auVar89._24_4_;
        auVar34._4_4_ = fVar133 * fVar133 * fVar133 * auVar79._4_4_ * -0.5;
        auVar34._0_4_ = fVar150 * fVar150 * fVar150 * auVar79._0_4_ * -0.5;
        auVar34._8_4_ = fVar134 * fVar134 * fVar134 * auVar79._8_4_ * -0.5;
        auVar34._12_4_ = fVar140 * fVar140 * fVar140 * auVar79._12_4_ * -0.5;
        auVar34._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar34._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar34._24_4_ = fVar77 * fVar77 * fVar77 * -0.0;
        auVar34._28_4_ = 0;
        auVar88 = vfmadd231ps_avx512vl(auVar34,auVar88,auVar89);
        auVar35._4_4_ = auVar104._4_4_ * auVar88._4_4_;
        auVar35._0_4_ = auVar104._0_4_ * auVar88._0_4_;
        auVar35._8_4_ = auVar104._8_4_ * auVar88._8_4_;
        auVar35._12_4_ = auVar104._12_4_ * auVar88._12_4_;
        auVar35._16_4_ = auVar104._16_4_ * auVar88._16_4_;
        auVar35._20_4_ = auVar104._20_4_ * auVar88._20_4_;
        auVar35._24_4_ = auVar104._24_4_ * auVar88._24_4_;
        auVar35._28_4_ = auVar89._28_4_;
        auVar36._4_4_ = -auVar103._4_4_ * auVar88._4_4_;
        auVar36._0_4_ = -auVar103._0_4_ * auVar88._0_4_;
        auVar36._8_4_ = -auVar103._8_4_ * auVar88._8_4_;
        auVar36._12_4_ = -auVar103._12_4_ * auVar88._12_4_;
        auVar36._16_4_ = -auVar103._16_4_ * auVar88._16_4_;
        auVar36._20_4_ = -auVar103._20_4_ * auVar88._20_4_;
        auVar36._24_4_ = -auVar103._24_4_ * auVar88._24_4_;
        auVar36._28_4_ = auVar103._28_4_ ^ 0x80000000;
        auVar88 = vmulps_avx512vl(auVar88,auVar96);
        auVar79 = vfmadd213ps_fma(auVar32,auVar85,auVar94);
        auVar80 = vfmadd213ps_fma(auVar33,auVar85,auVar87);
        auVar89 = vfmadd213ps_avx512vl(auVar91,auVar85,auVar100);
        auVar90 = vfmadd213ps_avx512vl(auVar35,ZEXT1632(auVar10),ZEXT1632(auVar8));
        auVar82 = vfnmadd213ps_fma(auVar32,auVar85,auVar94);
        auVar99 = ZEXT1632(auVar10);
        auVar81 = vfmadd213ps_fma(auVar36,auVar99,ZEXT1632(auVar9));
        auVar83 = vfnmadd213ps_fma(auVar33,auVar85,auVar87);
        auVar6 = vfmadd213ps_fma(auVar88,auVar99,auVar93);
        auVar92 = vfnmadd231ps_avx512vl(auVar100,auVar85,auVar91);
        auVar8 = vfnmadd213ps_fma(auVar35,auVar99,ZEXT1632(auVar8));
        auVar9 = vfnmadd213ps_fma(auVar36,auVar99,ZEXT1632(auVar9));
        auVar142 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar10),auVar88);
        auVar88 = vsubps_avx512vl(auVar90,ZEXT1632(auVar82));
        auVar91 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar83));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar6),auVar92);
        auVar100 = vmulps_avx512vl(auVar91,auVar92);
        auVar192 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar83),auVar93);
        auVar37._4_4_ = auVar82._4_4_ * auVar93._4_4_;
        auVar37._0_4_ = auVar82._0_4_ * auVar93._0_4_;
        auVar37._8_4_ = auVar82._8_4_ * auVar93._8_4_;
        auVar37._12_4_ = auVar82._12_4_ * auVar93._12_4_;
        auVar37._16_4_ = auVar93._16_4_ * 0.0;
        auVar37._20_4_ = auVar93._20_4_ * 0.0;
        auVar37._24_4_ = auVar93._24_4_ * 0.0;
        auVar37._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar37,auVar92,auVar88);
        auVar38._4_4_ = auVar83._4_4_ * auVar88._4_4_;
        auVar38._0_4_ = auVar83._0_4_ * auVar88._0_4_;
        auVar38._8_4_ = auVar83._8_4_ * auVar88._8_4_;
        auVar38._12_4_ = auVar83._12_4_ * auVar88._12_4_;
        auVar38._16_4_ = auVar88._16_4_ * 0.0;
        auVar38._20_4_ = auVar88._20_4_ * 0.0;
        auVar38._24_4_ = auVar88._24_4_ * 0.0;
        auVar38._28_4_ = auVar88._28_4_;
        auVar7 = vfmsub231ps_fma(auVar38,ZEXT1632(auVar82),auVar91);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar96,auVar93);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,ZEXT1632(auVar192));
        auVar97 = ZEXT1632(auVar84);
        uVar68 = vcmpps_avx512vl(auVar91,auVar97,2);
        bVar67 = (byte)uVar68;
        fVar77 = (float)((uint)(bVar67 & 1) * auVar79._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar8._0_4_);
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        fVar125 = (float)((uint)bVar17 * auVar79._4_4_ | (uint)!bVar17 * auVar8._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        fVar126 = (float)((uint)bVar17 * auVar79._8_4_ | (uint)!bVar17 * auVar8._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        fVar129 = (float)((uint)bVar17 * auVar79._12_4_ | (uint)!bVar17 * auVar8._12_4_);
        auVar100 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar126,CONCAT44(fVar125,fVar77))));
        fVar78 = (float)((uint)(bVar67 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar9._0_4_);
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        fVar149 = (float)((uint)bVar17 * auVar80._4_4_ | (uint)!bVar17 * auVar9._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        fVar127 = (float)((uint)bVar17 * auVar80._8_4_ | (uint)!bVar17 * auVar9._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        fVar130 = (float)((uint)bVar17 * auVar80._12_4_ | (uint)!bVar17 * auVar9._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar127,CONCAT44(fVar149,fVar78))));
        auVar105._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar142._0_4_
                    );
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar17 * auVar89._4_4_ | (uint)!bVar17 * auVar142._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar17 * auVar89._8_4_ | (uint)!bVar17 * auVar142._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar17 * auVar89._12_4_ | (uint)!bVar17 * auVar142._12_4_);
        fVar150 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar89._16_4_);
        auVar105._16_4_ = fVar150;
        fVar133 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar89._20_4_);
        auVar105._20_4_ = fVar133;
        fVar134 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar89._24_4_);
        auVar105._24_4_ = fVar134;
        iVar1 = (uint)(byte)(uVar68 >> 7) * auVar89._28_4_;
        auVar105._28_4_ = iVar1;
        auVar88 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar90);
        auVar106._0_4_ =
             (uint)(bVar67 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar192._0_4_;
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar17 * auVar88._4_4_ | (uint)!bVar17 * auVar192._4_4_;
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar17 * auVar88._8_4_ | (uint)!bVar17 * auVar192._8_4_;
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar17 * auVar88._12_4_ | (uint)!bVar17 * auVar192._12_4_;
        auVar106._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar88._16_4_;
        auVar106._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar88._20_4_;
        auVar106._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar88._24_4_;
        auVar106._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar88._28_4_;
        auVar88 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar81));
        auVar107._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar80._0_4_)
        ;
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar17 * auVar88._4_4_ | (uint)!bVar17 * auVar80._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar17 * auVar88._8_4_ | (uint)!bVar17 * auVar80._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar17 * auVar88._12_4_ | (uint)!bVar17 * auVar80._12_4_);
        fVar140 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar88._16_4_);
        auVar107._16_4_ = fVar140;
        fVar164 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar88._20_4_);
        auVar107._20_4_ = fVar164;
        fVar166 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar88._24_4_);
        auVar107._24_4_ = fVar166;
        auVar107._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar88._28_4_;
        auVar88 = vblendmps_avx512vl(auVar92,ZEXT1632(auVar6));
        auVar108._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar89._0_4_)
        ;
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar17 * auVar88._4_4_ | (uint)!bVar17 * auVar89._4_4_);
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar17 * auVar88._8_4_ | (uint)!bVar17 * auVar89._8_4_);
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar17 * auVar88._12_4_ | (uint)!bVar17 * auVar89._12_4_);
        bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar17 * auVar88._16_4_ | (uint)!bVar17 * auVar89._16_4_);
        bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar17 * auVar88._20_4_ | (uint)!bVar17 * auVar89._20_4_);
        bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar17 * auVar88._24_4_ | (uint)!bVar17 * auVar89._24_4_);
        bVar17 = SUB81(uVar68 >> 7,0);
        auVar108._28_4_ = (uint)bVar17 * auVar88._28_4_ | (uint)!bVar17 * auVar89._28_4_;
        auVar109._0_4_ =
             (uint)(bVar67 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar90._0_4_;
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar17 * (int)auVar82._4_4_ | (uint)!bVar17 * auVar90._4_4_;
        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar17 * (int)auVar82._8_4_ | (uint)!bVar17 * auVar90._8_4_;
        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar17 * (int)auVar82._12_4_ | (uint)!bVar17 * auVar90._12_4_;
        auVar109._16_4_ = (uint)!(bool)((byte)(uVar68 >> 4) & 1) * auVar90._16_4_;
        auVar109._20_4_ = (uint)!(bool)((byte)(uVar68 >> 5) & 1) * auVar90._20_4_;
        auVar109._24_4_ = (uint)!(bool)((byte)(uVar68 >> 6) & 1) * auVar90._24_4_;
        auVar109._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar90._28_4_;
        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar110._0_4_ =
             (uint)(bVar67 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar6._0_4_;
        bVar18 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar6._4_4_;
        bVar18 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar6._8_4_;
        bVar18 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar6._12_4_;
        auVar110._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar92._16_4_;
        auVar110._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar92._20_4_;
        auVar110._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar92._24_4_;
        iVar2 = (uint)(byte)(uVar68 >> 7) * auVar92._28_4_;
        auVar110._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar109,auVar100);
        auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar83._12_4_ |
                                                (uint)!bVar20 * auVar81._12_4_,
                                                CONCAT48((uint)bVar19 * (int)auVar83._8_4_ |
                                                         (uint)!bVar19 * auVar81._8_4_,
                                                         CONCAT44((uint)bVar17 * (int)auVar83._4_4_
                                                                  | (uint)!bVar17 * auVar81._4_4_,
                                                                  (uint)(bVar67 & 1) *
                                                                  (int)auVar83._0_4_ |
                                                                  (uint)!(bool)(bVar67 & 1) *
                                                                  auVar81._0_4_)))),auVar99);
        auVar89 = vsubps_avx(auVar110,auVar105);
        auVar90 = vsubps_avx(auVar100,auVar106);
        auVar92 = vsubps_avx(auVar99,auVar107);
        auVar93 = vsubps_avx(auVar105,auVar108);
        auVar39._4_4_ = auVar89._4_4_ * fVar125;
        auVar39._0_4_ = auVar89._0_4_ * fVar77;
        auVar39._8_4_ = auVar89._8_4_ * fVar126;
        auVar39._12_4_ = auVar89._12_4_ * fVar129;
        auVar39._16_4_ = auVar89._16_4_ * 0.0;
        auVar39._20_4_ = auVar89._20_4_ * 0.0;
        auVar39._24_4_ = auVar89._24_4_ * 0.0;
        auVar39._28_4_ = iVar2;
        auVar79 = vfmsub231ps_fma(auVar39,auVar105,auVar94);
        auVar40._4_4_ = fVar149 * auVar94._4_4_;
        auVar40._0_4_ = fVar78 * auVar94._0_4_;
        auVar40._8_4_ = fVar127 * auVar94._8_4_;
        auVar40._12_4_ = fVar130 * auVar94._12_4_;
        auVar40._16_4_ = auVar94._16_4_ * 0.0;
        auVar40._20_4_ = auVar94._20_4_ * 0.0;
        auVar40._24_4_ = auVar94._24_4_ * 0.0;
        auVar40._28_4_ = auVar91._28_4_;
        auVar80 = vfmsub231ps_fma(auVar40,auVar100,auVar88);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar97,ZEXT1632(auVar79));
        auVar157._0_4_ = auVar88._0_4_ * auVar105._0_4_;
        auVar157._4_4_ = auVar88._4_4_ * auVar105._4_4_;
        auVar157._8_4_ = auVar88._8_4_ * auVar105._8_4_;
        auVar157._12_4_ = auVar88._12_4_ * auVar105._12_4_;
        auVar157._16_4_ = auVar88._16_4_ * fVar150;
        auVar157._20_4_ = auVar88._20_4_ * fVar133;
        auVar157._24_4_ = auVar88._24_4_ * fVar134;
        auVar157._28_4_ = 0;
        auVar79 = vfmsub231ps_fma(auVar157,auVar99,auVar89);
        auVar87 = vfmadd231ps_avx512vl(auVar91,auVar97,ZEXT1632(auVar79));
        auVar91 = vmulps_avx512vl(auVar93,auVar106);
        auVar91 = vfmsub231ps_avx512vl(auVar91,auVar90,auVar108);
        auVar41._4_4_ = auVar92._4_4_ * auVar108._4_4_;
        auVar41._0_4_ = auVar92._0_4_ * auVar108._0_4_;
        auVar41._8_4_ = auVar92._8_4_ * auVar108._8_4_;
        auVar41._12_4_ = auVar92._12_4_ * auVar108._12_4_;
        auVar41._16_4_ = auVar92._16_4_ * auVar108._16_4_;
        auVar41._20_4_ = auVar92._20_4_ * auVar108._20_4_;
        auVar41._24_4_ = auVar92._24_4_ * auVar108._24_4_;
        auVar41._28_4_ = auVar108._28_4_;
        auVar79 = vfmsub231ps_fma(auVar41,auVar107,auVar93);
        auVar158._0_4_ = auVar107._0_4_ * auVar90._0_4_;
        auVar158._4_4_ = auVar107._4_4_ * auVar90._4_4_;
        auVar158._8_4_ = auVar107._8_4_ * auVar90._8_4_;
        auVar158._12_4_ = auVar107._12_4_ * auVar90._12_4_;
        auVar158._16_4_ = fVar140 * auVar90._16_4_;
        auVar158._20_4_ = fVar164 * auVar90._20_4_;
        auVar158._24_4_ = fVar166 * auVar90._24_4_;
        auVar158._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar158,auVar92,auVar106);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar97,auVar91);
        auVar96 = vfmadd231ps_avx512vl(auVar91,auVar97,ZEXT1632(auVar79));
        auVar91 = vmaxps_avx(auVar87,auVar96);
        uVar141 = vcmpps_avx512vl(auVar91,auVar97,2);
        bVar76 = bVar76 & (byte)uVar141;
        auVar189 = ZEXT3264(local_780);
        auVar190 = ZEXT3264(local_740);
        auVar187 = ZEXT3264(local_8e0);
        if (bVar76 == 0) {
          uVar72 = 0;
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar194 = ZEXT3264(auVar91);
          auVar139 = ZEXT3264(local_860);
          auVar195 = ZEXT3264(local_820);
          auVar196 = ZEXT3264(local_840);
        }
        else {
          uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar179._4_4_ = uVar135;
          auVar179._0_4_ = uVar135;
          auVar179._8_4_ = uVar135;
          auVar179._12_4_ = uVar135;
          auVar179._16_4_ = uVar135;
          auVar179._20_4_ = uVar135;
          auVar179._24_4_ = uVar135;
          auVar179._28_4_ = uVar135;
          auVar181 = ZEXT3264(auVar179);
          auVar42._4_4_ = auVar93._4_4_ * auVar88._4_4_;
          auVar42._0_4_ = auVar93._0_4_ * auVar88._0_4_;
          auVar42._8_4_ = auVar93._8_4_ * auVar88._8_4_;
          auVar42._12_4_ = auVar93._12_4_ * auVar88._12_4_;
          auVar42._16_4_ = auVar93._16_4_ * auVar88._16_4_;
          auVar42._20_4_ = auVar93._20_4_ * auVar88._20_4_;
          auVar42._24_4_ = auVar93._24_4_ * auVar88._24_4_;
          auVar42._28_4_ = auVar91._28_4_;
          auVar81 = vfmsub231ps_fma(auVar42,auVar92,auVar89);
          auVar43._4_4_ = auVar89._4_4_ * auVar90._4_4_;
          auVar43._0_4_ = auVar89._0_4_ * auVar90._0_4_;
          auVar43._8_4_ = auVar89._8_4_ * auVar90._8_4_;
          auVar43._12_4_ = auVar89._12_4_ * auVar90._12_4_;
          auVar43._16_4_ = auVar89._16_4_ * auVar90._16_4_;
          auVar43._20_4_ = auVar89._20_4_ * auVar90._20_4_;
          auVar43._24_4_ = auVar89._24_4_ * auVar90._24_4_;
          auVar43._28_4_ = auVar89._28_4_;
          auVar80 = vfmsub231ps_fma(auVar43,auVar94,auVar93);
          auVar44._4_4_ = auVar92._4_4_ * auVar94._4_4_;
          auVar44._0_4_ = auVar92._0_4_ * auVar94._0_4_;
          auVar44._8_4_ = auVar92._8_4_ * auVar94._8_4_;
          auVar44._12_4_ = auVar92._12_4_ * auVar94._12_4_;
          auVar44._16_4_ = auVar92._16_4_ * auVar94._16_4_;
          auVar44._20_4_ = auVar92._20_4_ * auVar94._20_4_;
          auVar44._24_4_ = auVar92._24_4_ * auVar94._24_4_;
          auVar44._28_4_ = auVar92._28_4_;
          auVar6 = vfmsub231ps_fma(auVar44,auVar90,auVar88);
          auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar6));
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar81),auVar97);
          auVar88 = vrcp14ps_avx512vl(auVar91);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar194 = ZEXT3264(auVar89);
          auVar90 = vfnmadd213ps_avx512vl(auVar88,auVar91,auVar89);
          auVar79 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
          auVar45._4_4_ = auVar6._4_4_ * auVar105._4_4_;
          auVar45._0_4_ = auVar6._0_4_ * auVar105._0_4_;
          auVar45._8_4_ = auVar6._8_4_ * auVar105._8_4_;
          auVar45._12_4_ = auVar6._12_4_ * auVar105._12_4_;
          auVar45._16_4_ = fVar150 * 0.0;
          auVar45._20_4_ = fVar133 * 0.0;
          auVar45._24_4_ = fVar134 * 0.0;
          auVar45._28_4_ = iVar1;
          auVar80 = vfmadd231ps_fma(auVar45,auVar99,ZEXT1632(auVar80));
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar100,ZEXT1632(auVar81));
          fVar150 = auVar79._0_4_;
          fVar133 = auVar79._4_4_;
          fVar134 = auVar79._8_4_;
          fVar140 = auVar79._12_4_;
          local_600 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar140,
                                         CONCAT48(auVar80._8_4_ * fVar134,
                                                  CONCAT44(auVar80._4_4_ * fVar133,
                                                           auVar80._0_4_ * fVar150))));
          auVar168._4_4_ = uVar74;
          auVar168._0_4_ = uVar74;
          auVar168._8_4_ = uVar74;
          auVar168._12_4_ = uVar74;
          auVar168._16_4_ = uVar74;
          auVar168._20_4_ = uVar74;
          auVar168._24_4_ = uVar74;
          auVar168._28_4_ = uVar74;
          uVar141 = vcmpps_avx512vl(local_600,auVar179,2);
          uVar23 = vcmpps_avx512vl(auVar168,local_600,2);
          bVar76 = (byte)uVar141 & (byte)uVar23 & bVar76;
          auVar195 = ZEXT3264(local_820);
          auVar196 = ZEXT3264(local_840);
          auVar186 = ZEXT3264(auVar95);
          if (bVar76 == 0) {
            uVar72 = 0;
            auVar139 = ZEXT3264(local_860);
          }
          else {
            uVar141 = vcmpps_avx512vl(auVar91,auVar97,4);
            bVar76 = bVar76 & (byte)uVar141;
            auVar139 = ZEXT3264(local_860);
            if (bVar76 != 0) {
              fVar164 = auVar87._0_4_ * fVar150;
              fVar166 = auVar87._4_4_ * fVar133;
              auVar46._4_4_ = fVar166;
              auVar46._0_4_ = fVar164;
              fVar77 = auVar87._8_4_ * fVar134;
              auVar46._8_4_ = fVar77;
              fVar78 = auVar87._12_4_ * fVar140;
              auVar46._12_4_ = fVar78;
              fVar125 = auVar87._16_4_ * 0.0;
              auVar46._16_4_ = fVar125;
              fVar149 = auVar87._20_4_ * 0.0;
              auVar46._20_4_ = fVar149;
              fVar126 = auVar87._24_4_ * 0.0;
              auVar46._24_4_ = fVar126;
              auVar46._28_4_ = auVar91._28_4_;
              auVar88 = vsubps_avx512vl(auVar89,auVar46);
              local_640._0_4_ =
                   (float)((uint)(bVar67 & 1) * (int)fVar164 |
                          (uint)!(bool)(bVar67 & 1) * auVar88._0_4_);
              bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
              local_640._4_4_ = (float)((uint)bVar17 * (int)fVar166 | (uint)!bVar17 * auVar88._4_4_)
              ;
              bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
              local_640._8_4_ = (float)((uint)bVar17 * (int)fVar77 | (uint)!bVar17 * auVar88._8_4_);
              bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
              local_640._12_4_ =
                   (float)((uint)bVar17 * (int)fVar78 | (uint)!bVar17 * auVar88._12_4_);
              bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
              local_640._16_4_ =
                   (float)((uint)bVar17 * (int)fVar125 | (uint)!bVar17 * auVar88._16_4_);
              bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
              local_640._20_4_ =
                   (float)((uint)bVar17 * (int)fVar149 | (uint)!bVar17 * auVar88._20_4_);
              bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
              local_640._24_4_ =
                   (float)((uint)bVar17 * (int)fVar126 | (uint)!bVar17 * auVar88._24_4_);
              bVar17 = SUB81(uVar68 >> 7,0);
              local_640._28_4_ =
                   (float)((uint)bVar17 * auVar91._28_4_ | (uint)!bVar17 * auVar88._28_4_);
              auVar91 = vsubps_avx(ZEXT1632(auVar10),auVar85);
              auVar79 = vfmadd213ps_fma(auVar91,local_640,auVar85);
              uVar135 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar25._4_4_ = uVar135;
              auVar25._0_4_ = uVar135;
              auVar25._8_4_ = uVar135;
              auVar25._12_4_ = uVar135;
              auVar25._16_4_ = uVar135;
              auVar25._20_4_ = uVar135;
              auVar25._24_4_ = uVar135;
              auVar25._28_4_ = uVar135;
              auVar91 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                           CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                    CONCAT44(auVar79._4_4_ +
                                                                             auVar79._4_4_,
                                                                             auVar79._0_4_ +
                                                                             auVar79._0_4_)))),
                                        auVar25);
              uVar141 = vcmpps_avx512vl(local_600,auVar91,6);
              if (((byte)uVar141 & bVar76) != 0) {
                auVar155._0_4_ = auVar96._0_4_ * fVar150;
                auVar155._4_4_ = auVar96._4_4_ * fVar133;
                auVar155._8_4_ = auVar96._8_4_ * fVar134;
                auVar155._12_4_ = auVar96._12_4_ * fVar140;
                auVar155._16_4_ = auVar96._16_4_ * 0.0;
                auVar155._20_4_ = auVar96._20_4_ * 0.0;
                auVar155._24_4_ = auVar96._24_4_ * 0.0;
                auVar155._28_4_ = 0;
                auVar91 = vsubps_avx512vl(auVar89,auVar155);
                auVar111._0_4_ =
                     (uint)(bVar67 & 1) * (int)auVar155._0_4_ |
                     (uint)!(bool)(bVar67 & 1) * auVar91._0_4_;
                bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
                auVar111._4_4_ = (uint)bVar17 * (int)auVar155._4_4_ | (uint)!bVar17 * auVar91._4_4_;
                bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
                auVar111._8_4_ = (uint)bVar17 * (int)auVar155._8_4_ | (uint)!bVar17 * auVar91._8_4_;
                bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
                auVar111._12_4_ =
                     (uint)bVar17 * (int)auVar155._12_4_ | (uint)!bVar17 * auVar91._12_4_;
                bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
                auVar111._16_4_ =
                     (uint)bVar17 * (int)auVar155._16_4_ | (uint)!bVar17 * auVar91._16_4_;
                bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
                auVar111._20_4_ =
                     (uint)bVar17 * (int)auVar155._20_4_ | (uint)!bVar17 * auVar91._20_4_;
                bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
                auVar111._24_4_ =
                     (uint)bVar17 * (int)auVar155._24_4_ | (uint)!bVar17 * auVar91._24_4_;
                auVar111._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar91._28_4_;
                auVar26._8_4_ = 0x40000000;
                auVar26._0_8_ = 0x4000000040000000;
                auVar26._12_4_ = 0x40000000;
                auVar26._16_4_ = 0x40000000;
                auVar26._20_4_ = 0x40000000;
                auVar26._24_4_ = 0x40000000;
                auVar26._28_4_ = 0x40000000;
                local_620 = vfmsub132ps_avx512vl(auVar111,auVar89,auVar26);
                local_5e0 = 0;
                local_5d0 = local_870._0_8_;
                uStack_5c8 = local_870._8_8_;
                local_5c0 = local_880._0_8_;
                uStack_5b8 = local_880._8_8_;
                local_5b0 = local_890._0_8_;
                uStack_5a8 = local_890._8_8_;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar72 = CONCAT71((int7)(uVar72 >> 8),1),
                     pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar150 = 1.0 / auVar171._0_4_;
                    local_580[0] = fVar150 * (local_640._0_4_ + 0.0);
                    local_580[1] = fVar150 * (local_640._4_4_ + 1.0);
                    local_580[2] = fVar150 * (local_640._8_4_ + 2.0);
                    local_580[3] = fVar150 * (local_640._12_4_ + 3.0);
                    fStack_570 = fVar150 * (local_640._16_4_ + 4.0);
                    fStack_56c = fVar150 * (local_640._20_4_ + 5.0);
                    fStack_568 = fVar150 * (local_640._24_4_ + 6.0);
                    fStack_564 = local_640._28_4_ + 7.0;
                    local_560 = local_620;
                    local_540 = local_600;
                    local_700 = 0;
                    uVar73 = (ulong)((byte)uVar141 & bVar76);
                    for (uVar68 = uVar73; (uVar68 & 1) == 0;
                        uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                      local_700 = local_700 + 1;
                    }
                    auVar194 = vpbroadcastd_avx512f();
                    local_440 = vmovdqa64_avx512f(auVar194);
                    auVar194 = vpbroadcastd_avx512f();
                    local_500 = vmovdqa64_avx512f(auVar194);
                    local_7c0 = auVar95;
                    local_760 = auVar179;
                    local_5dc = iVar13;
                    do {
                      auVar192 = auVar193._0_16_;
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[local_700]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)(local_560 + local_700 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_540 + local_700 * 4);
                      local_910.context = context->user;
                      fVar133 = local_200._0_4_;
                      fVar150 = 1.0 - fVar133;
                      auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar133 * (fVar150 + fVar150))),
                                                ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                      auVar81 = local_200._0_16_;
                      auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar81,
                                                ZEXT416(0xc0a00000));
                      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133 * 3.0)),
                                                ZEXT416((uint)(fVar133 + fVar133)),auVar79);
                      auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar81,
                                                ZEXT416(0x40000000));
                      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                                ZEXT416((uint)(fVar150 + fVar150)),auVar79);
                      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),auVar81,
                                                ZEXT416((uint)(fVar150 * -2.0)));
                      fVar150 = auVar6._0_4_ * 0.5;
                      fVar133 = auVar80._0_4_ * 0.5;
                      fVar134 = auVar79._0_4_ * 0.5;
                      fVar140 = auVar81._0_4_ * 0.5;
                      auVar151._0_4_ = fVar140 * (float)local_710._0_4_;
                      auVar151._4_4_ = fVar140 * (float)local_710._4_4_;
                      auVar151._8_4_ = fVar140 * fStack_708;
                      auVar151._12_4_ = fVar140 * fStack_704;
                      auVar161._4_4_ = fVar134;
                      auVar161._0_4_ = fVar134;
                      auVar161._8_4_ = fVar134;
                      auVar161._12_4_ = fVar134;
                      auVar79 = vfmadd132ps_fma(auVar161,auVar151,local_890);
                      auVar152._4_4_ = fVar133;
                      auVar152._0_4_ = fVar133;
                      auVar152._8_4_ = fVar133;
                      auVar152._12_4_ = fVar133;
                      auVar79 = vfmadd132ps_fma(auVar152,auVar79,local_880);
                      auVar136._4_4_ = fVar150;
                      auVar136._0_4_ = fVar150;
                      auVar136._8_4_ = fVar150;
                      auVar136._12_4_ = fVar150;
                      auVar79 = vfmadd132ps_fma(auVar136,auVar79,local_870);
                      auVar194 = vbroadcastss_avx512f(auVar79);
                      auVar123 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar123,ZEXT1664(auVar79));
                      auVar123 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar123,ZEXT1664(auVar79));
                      local_2c0[0] = (RTCHitN)auVar194[0];
                      local_2c0[1] = (RTCHitN)auVar194[1];
                      local_2c0[2] = (RTCHitN)auVar194[2];
                      local_2c0[3] = (RTCHitN)auVar194[3];
                      local_2c0[4] = (RTCHitN)auVar194[4];
                      local_2c0[5] = (RTCHitN)auVar194[5];
                      local_2c0[6] = (RTCHitN)auVar194[6];
                      local_2c0[7] = (RTCHitN)auVar194[7];
                      local_2c0[8] = (RTCHitN)auVar194[8];
                      local_2c0[9] = (RTCHitN)auVar194[9];
                      local_2c0[10] = (RTCHitN)auVar194[10];
                      local_2c0[0xb] = (RTCHitN)auVar194[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar194[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar194[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar194[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar194[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar194[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar194[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar194[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar194[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar194[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar194[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar194[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar194[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar194[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar194[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar194[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar194[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar194[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar194[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar194[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar194[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar194[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar194[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar194[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar194[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar194[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar194[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar194[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar194[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar194[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar194[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar194[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar194[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar194[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar194[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar194[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar194[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar194[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar194[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar194[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar194[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar194[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar194[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar194[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar194[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar194[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar194[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar194[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar194[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar194[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar194[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar194[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar194[0x3f];
                      local_180 = local_500._0_8_;
                      uStack_178 = local_500._8_8_;
                      uStack_170 = local_500._16_8_;
                      uStack_168 = local_500._24_8_;
                      uStack_160 = local_500._32_8_;
                      uStack_158 = local_500._40_8_;
                      uStack_150 = local_500._48_8_;
                      uStack_148 = local_500._56_8_;
                      auVar194 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar194);
                      vpcmpeqd_avx2(auVar194._0_32_,auVar194._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                      auVar123 = vmovdqa64_avx512f(local_300);
                      local_6c0 = vmovdqa64_avx512f(auVar123);
                      local_910.valid = (int *)local_6c0;
                      local_910.geometryUserPtr = pGVar14->userPtr;
                      local_910.hit = local_2c0;
                      local_910.N = 0x10;
                      local_6e0 = (uint)uVar73;
                      uStack_6dc = (uint)(uVar73 >> 0x20);
                      local_910.ray = (RTCRayN *)ray;
                      if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar14->occlusionFilterN)(&local_910);
                        uVar73 = CONCAT44(uStack_6dc,local_6e0);
                        auVar181 = ZEXT3264(local_760);
                        auVar186 = ZEXT3264(local_7c0);
                        auVar196 = ZEXT3264(local_840);
                        auVar195 = ZEXT3264(local_820);
                        auVar139 = ZEXT3264(local_860);
                        auVar187 = ZEXT3264(local_8e0);
                        auVar188 = ZEXT3264(local_8c0);
                        auVar191 = ZEXT3264(local_7a0);
                        auVar190 = ZEXT3264(local_740);
                        auVar189 = ZEXT3264(local_780);
                        auVar79 = vxorps_avx512vl(auVar192,auVar192);
                        auVar193 = ZEXT1664(auVar79);
                        auVar123 = vmovdqa64_avx512f(local_6c0);
                        uVar74 = local_7e0._0_4_;
                      }
                      auVar79 = auVar193._0_16_;
                      uVar141 = vptestmd_avx512f(auVar123,auVar123);
                      if ((short)uVar141 == 0) {
                        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar194 = ZEXT3264(auVar91);
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if (p_Var16 == (RTCFilterFunctionN)0x0) {
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar194 = ZEXT3264(auVar91);
                        }
                        else {
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar194 = ZEXT3264(auVar91);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var16)(&local_910);
                            uVar73 = CONCAT44(uStack_6dc,local_6e0);
                            auVar181 = ZEXT3264(local_760);
                            auVar186 = ZEXT3264(local_7c0);
                            auVar196 = ZEXT3264(local_840);
                            auVar195 = ZEXT3264(local_820);
                            auVar139 = ZEXT3264(local_860);
                            auVar187 = ZEXT3264(local_8e0);
                            auVar188 = ZEXT3264(local_8c0);
                            auVar191 = ZEXT3264(local_7a0);
                            auVar190 = ZEXT3264(local_740);
                            auVar189 = ZEXT3264(local_780);
                            auVar79 = vxorps_avx512vl(auVar79,auVar79);
                            auVar193 = ZEXT1664(auVar79);
                            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar194 = ZEXT3264(auVar91);
                            auVar123 = vmovdqa64_avx512f(local_6c0);
                            uVar74 = local_7e0._0_4_;
                          }
                        }
                        auVar95 = auVar186._0_32_;
                        uVar68 = vptestmd_avx512f(auVar123,auVar123);
                        auVar124 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar17 = (bool)((byte)uVar68 & 1);
                        auVar123._0_4_ =
                             (uint)bVar17 * auVar124._0_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x200);
                        bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
                        auVar123._4_4_ =
                             (uint)bVar17 * auVar124._4_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x204);
                        bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
                        auVar123._8_4_ =
                             (uint)bVar17 * auVar124._8_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x208);
                        bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
                        auVar123._12_4_ =
                             (uint)bVar17 * auVar124._12_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x20c);
                        bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
                        auVar123._16_4_ =
                             (uint)bVar17 * auVar124._16_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x210);
                        bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
                        auVar123._20_4_ =
                             (uint)bVar17 * auVar124._20_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x214);
                        bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
                        auVar123._24_4_ =
                             (uint)bVar17 * auVar124._24_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x218);
                        bVar17 = (bool)((byte)(uVar68 >> 7) & 1);
                        auVar123._28_4_ =
                             (uint)bVar17 * auVar124._28_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x21c);
                        bVar17 = (bool)((byte)(uVar68 >> 8) & 1);
                        auVar123._32_4_ =
                             (uint)bVar17 * auVar124._32_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x220);
                        bVar17 = (bool)((byte)(uVar68 >> 9) & 1);
                        auVar123._36_4_ =
                             (uint)bVar17 * auVar124._36_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x224);
                        bVar17 = (bool)((byte)(uVar68 >> 10) & 1);
                        auVar123._40_4_ =
                             (uint)bVar17 * auVar124._40_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x228);
                        bVar17 = (bool)((byte)(uVar68 >> 0xb) & 1);
                        auVar123._44_4_ =
                             (uint)bVar17 * auVar124._44_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x22c);
                        bVar17 = (bool)((byte)(uVar68 >> 0xc) & 1);
                        auVar123._48_4_ =
                             (uint)bVar17 * auVar124._48_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x230);
                        bVar17 = (bool)((byte)(uVar68 >> 0xd) & 1);
                        auVar123._52_4_ =
                             (uint)bVar17 * auVar124._52_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x234);
                        bVar17 = (bool)((byte)(uVar68 >> 0xe) & 1);
                        auVar123._56_4_ =
                             (uint)bVar17 * auVar124._56_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x238);
                        bVar17 = SUB81(uVar68 >> 0xf,0);
                        auVar123._60_4_ =
                             (uint)bVar17 * auVar124._60_4_ |
                             (uint)!bVar17 * *(int *)(local_910.ray + 0x23c);
                        *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar123;
                        if ((short)uVar68 != 0) {
                          uVar72 = CONCAT71((int7)(uVar72 >> 8),1);
                          break;
                        }
                      }
                      auVar95 = auVar186._0_32_;
                      *(int *)(ray + k * 4 + 0x200) = auVar181._0_4_;
                      uVar68 = local_700 & 0x3f;
                      uVar72 = 0;
                      local_700 = 0;
                      uVar73 = uVar73 ^ 1L << uVar68;
                      for (uVar68 = uVar73; (uVar68 & 1) == 0;
                          uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                        local_700 = local_700 + 1;
                      }
                    } while (uVar73 != 0);
                  }
                  goto LAB_01e8a458;
                }
              }
            }
            uVar72 = 0;
          }
        }
      }
LAB_01e8a458:
      if (8 < iVar13) {
        local_7e0 = vpbroadcastd_avx512vl();
        uStack_65c = local_660;
        uStack_658 = local_660;
        uStack_654 = local_660;
        uStack_650 = local_660;
        uStack_64c = local_660;
        uStack_648 = local_660;
        uStack_644 = local_660;
        fStack_6f8 = 1.0 / (float)local_4c0._0_4_;
        auVar181 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar181);
        auVar181 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar181);
        lVar75 = 8;
        local_7c0 = auVar95;
        fStack_6f4 = fStack_6f8;
        fStack_6f0 = fStack_6f8;
        fStack_6ec = fStack_6f8;
        fStack_6e8 = fStack_6f8;
        fStack_6e4 = fStack_6f8;
        local_6e0 = uVar74;
        uStack_6dc = uVar74;
        uStack_6d8 = uVar74;
        uStack_6d4 = uVar74;
        uStack_6d0 = uVar74;
        uStack_6cc = uVar74;
        uStack_6c8 = uVar74;
        uStack_6c4 = uVar74;
        local_700._0_4_ = fStack_6f8;
        local_700._4_4_ = fStack_6f8;
        do {
          auVar91 = vpbroadcastd_avx512vl();
          auVar92 = vpor_avx2(auVar91,_DAT_01fe9900);
          uVar23 = vpcmpd_avx512vl(auVar92,local_7e0,1);
          auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar75 * 4 + lVar24);
          auVar88 = *(undefined1 (*) [32])(lVar24 + 0x21b37f0 + lVar75 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar24 + 0x21b3c74 + lVar75 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21b40f8 + lVar75 * 4);
          local_820 = auVar195._0_32_;
          auVar93 = vmulps_avx512vl(local_820,auVar90);
          local_840 = auVar196._0_32_;
          auVar100 = vmulps_avx512vl(local_840,auVar90);
          auVar47._4_4_ = auVar90._4_4_ * (float)local_3a0._4_4_;
          auVar47._0_4_ = auVar90._0_4_ * (float)local_3a0._0_4_;
          auVar47._8_4_ = auVar90._8_4_ * fStack_398;
          auVar47._12_4_ = auVar90._12_4_ * fStack_394;
          auVar47._16_4_ = auVar90._16_4_ * fStack_390;
          auVar47._20_4_ = auVar90._20_4_ * fStack_38c;
          auVar47._24_4_ = auVar90._24_4_ * fStack_388;
          auVar47._28_4_ = auVar92._28_4_;
          auVar143 = auVar187._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar143);
          local_860 = auVar139._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar100,auVar89,local_860);
          auVar100 = vfmadd231ps_avx512vl(auVar47,auVar89,local_380);
          auVar165 = auVar191._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,auVar165);
          auVar147 = auVar188._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar147);
          auVar79 = vfmadd231ps_fma(auVar100,auVar88,local_360);
          auVar163 = auVar189._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar163);
          local_740 = auVar190._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar93,auVar91,local_740);
          auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar75 * 4 + lVar24);
          auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21b5c10 + lVar75 * 4);
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar91,local_340);
          auVar100 = *(undefined1 (*) [32])(lVar24 + 0x21b6094 + lVar75 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar24 + 0x21b6518 + lVar75 * 4);
          auVar95 = vmulps_avx512vl(local_820,auVar99);
          auVar94 = vmulps_avx512vl(local_840,auVar99);
          auVar48._4_4_ = auVar99._4_4_ * (float)local_3a0._4_4_;
          auVar48._0_4_ = auVar99._0_4_ * (float)local_3a0._0_4_;
          auVar48._8_4_ = auVar99._8_4_ * fStack_398;
          auVar48._12_4_ = auVar99._12_4_ * fStack_394;
          auVar48._16_4_ = auVar99._16_4_ * fStack_390;
          auVar48._20_4_ = auVar99._20_4_ * fStack_38c;
          auVar48._24_4_ = auVar99._24_4_ * fStack_388;
          auVar48._28_4_ = uStack_384;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar143);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_860);
          auVar97 = vfmadd231ps_avx512vl(auVar48,auVar100,local_380);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar165);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar147);
          auVar80 = vfmadd231ps_fma(auVar97,auVar93,local_360);
          auVar97 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar163);
          auVar85 = vfmadd231ps_avx512vl(auVar94,auVar92,local_740);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar92,local_340);
          auVar86 = vmaxps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80));
          auVar95 = vsubps_avx(auVar97,auVar87);
          auVar94 = vsubps_avx(auVar85,auVar96);
          auVar98 = vmulps_avx512vl(auVar96,auVar95);
          auVar112 = vmulps_avx512vl(auVar87,auVar94);
          auVar98 = vsubps_avx512vl(auVar98,auVar112);
          auVar112 = vmulps_avx512vl(auVar94,auVar94);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar95,auVar95);
          auVar86 = vmulps_avx512vl(auVar86,auVar86);
          auVar86 = vmulps_avx512vl(auVar86,auVar112);
          auVar98 = vmulps_avx512vl(auVar98,auVar98);
          uVar141 = vcmpps_avx512vl(auVar98,auVar86,2);
          bVar76 = (byte)uVar23 & (byte)uVar141;
          if (bVar76 == 0) {
            auVar187 = ZEXT3264(auVar143);
          }
          else {
            auVar99 = vmulps_avx512vl(local_7c0,auVar99);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_400,auVar99);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_3e0,auVar100);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_3c0,auVar93);
            auVar90 = vmulps_avx512vl(local_7c0,auVar90);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_400,auVar90);
            auVar88 = vfmadd213ps_avx512vl(auVar88,local_3e0,auVar89);
            auVar93 = vfmadd213ps_avx512vl(auVar91,local_3c0,auVar88);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b457c + lVar75 * 4);
            auVar88 = *(undefined1 (*) [32])(lVar24 + 0x21b4a00 + lVar75 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar24 + 0x21b4e84 + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21b5308 + lVar75 * 4);
            auVar100 = vmulps_avx512vl(local_820,auVar90);
            auVar99 = vmulps_avx512vl(local_840,auVar90);
            auVar90 = vmulps_avx512vl(local_7c0,auVar90);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar89,auVar143);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,local_860);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_400,auVar89);
            auVar90 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar165);
            auVar100 = vfmadd231ps_avx512vl(auVar99,auVar88,auVar147);
            auVar88 = vfmadd231ps_avx512vl(auVar89,local_3e0,auVar88);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar163);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,local_740);
            auVar99 = vfmadd231ps_avx512vl(auVar88,local_3c0,auVar91);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b699c + lVar75 * 4);
            auVar88 = *(undefined1 (*) [32])(lVar24 + 0x21b72a4 + lVar75 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar24 + 0x21b7728 + lVar75 * 4);
            auVar86 = vmulps_avx512vl(local_820,auVar89);
            auVar98 = vmulps_avx512vl(local_840,auVar89);
            auVar89 = vmulps_avx512vl(local_7c0,auVar89);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar88,auVar143);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,local_860);
            auVar89 = vfmadd231ps_avx512vl(auVar89,local_400,auVar88);
            auVar88 = *(undefined1 (*) [32])(lVar24 + 0x21b6e20 + lVar75 * 4);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar88,auVar165);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,auVar147);
            auVar88 = vfmadd231ps_avx512vl(auVar89,local_3e0,auVar88);
            auVar89 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar163);
            auVar86 = vfmadd231ps_avx512vl(auVar98,auVar91,local_740);
            auVar88 = vfmadd231ps_avx512vl(auVar88,local_3c0,auVar91);
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar90,auVar98);
            vandps_avx512vl(auVar100,auVar98);
            auVar91 = vmaxps_avx(auVar98,auVar98);
            vandps_avx512vl(auVar99,auVar98);
            auVar91 = vmaxps_avx(auVar91,auVar98);
            auVar66._4_4_ = uStack_65c;
            auVar66._0_4_ = local_660;
            auVar66._8_4_ = uStack_658;
            auVar66._12_4_ = uStack_654;
            auVar66._16_4_ = uStack_650;
            auVar66._20_4_ = uStack_64c;
            auVar66._24_4_ = uStack_648;
            auVar66._28_4_ = uStack_644;
            uVar68 = vcmpps_avx512vl(auVar91,auVar66,1);
            bVar17 = (bool)((byte)uVar68 & 1);
            auVar113._0_4_ = (float)((uint)bVar17 * auVar95._0_4_ | (uint)!bVar17 * auVar90._0_4_);
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar90._4_4_);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar90._8_4_);
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar90._12_4_);
            bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar113._16_4_ =
                 (float)((uint)bVar17 * auVar95._16_4_ | (uint)!bVar17 * auVar90._16_4_);
            bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar113._20_4_ =
                 (float)((uint)bVar17 * auVar95._20_4_ | (uint)!bVar17 * auVar90._20_4_);
            bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar113._24_4_ =
                 (float)((uint)bVar17 * auVar95._24_4_ | (uint)!bVar17 * auVar90._24_4_);
            bVar17 = SUB81(uVar68 >> 7,0);
            auVar113._28_4_ = (uint)bVar17 * auVar95._28_4_ | (uint)!bVar17 * auVar90._28_4_;
            bVar17 = (bool)((byte)uVar68 & 1);
            auVar114._0_4_ = (float)((uint)bVar17 * auVar94._0_4_ | (uint)!bVar17 * auVar100._0_4_);
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar100._4_4_);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar100._8_4_);
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar100._12_4_);
            bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar114._16_4_ =
                 (float)((uint)bVar17 * auVar94._16_4_ | (uint)!bVar17 * auVar100._16_4_);
            bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar114._20_4_ =
                 (float)((uint)bVar17 * auVar94._20_4_ | (uint)!bVar17 * auVar100._20_4_);
            bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar114._24_4_ =
                 (float)((uint)bVar17 * auVar94._24_4_ | (uint)!bVar17 * auVar100._24_4_);
            bVar17 = SUB81(uVar68 >> 7,0);
            auVar114._28_4_ = (uint)bVar17 * auVar94._28_4_ | (uint)!bVar17 * auVar100._28_4_;
            vandps_avx512vl(auVar89,auVar98);
            vandps_avx512vl(auVar86,auVar98);
            auVar91 = vmaxps_avx(auVar114,auVar114);
            vandps_avx512vl(auVar88,auVar98);
            auVar91 = vmaxps_avx(auVar91,auVar114);
            uVar68 = vcmpps_avx512vl(auVar91,auVar66,1);
            bVar17 = (bool)((byte)uVar68 & 1);
            auVar115._0_4_ = (uint)bVar17 * auVar95._0_4_ | (uint)!bVar17 * auVar89._0_4_;
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar89._4_4_;
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar89._8_4_;
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar89._12_4_;
            bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar115._16_4_ = (uint)bVar17 * auVar95._16_4_ | (uint)!bVar17 * auVar89._16_4_;
            bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar115._20_4_ = (uint)bVar17 * auVar95._20_4_ | (uint)!bVar17 * auVar89._20_4_;
            bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar115._24_4_ = (uint)bVar17 * auVar95._24_4_ | (uint)!bVar17 * auVar89._24_4_;
            bVar17 = SUB81(uVar68 >> 7,0);
            auVar115._28_4_ = (uint)bVar17 * auVar95._28_4_ | (uint)!bVar17 * auVar89._28_4_;
            bVar17 = (bool)((byte)uVar68 & 1);
            auVar116._0_4_ = (float)((uint)bVar17 * auVar94._0_4_ | (uint)!bVar17 * auVar86._0_4_);
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar86._4_4_);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar86._8_4_);
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar86._12_4_);
            bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar17 * auVar94._16_4_ | (uint)!bVar17 * auVar86._16_4_);
            bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar17 * auVar94._20_4_ | (uint)!bVar17 * auVar86._20_4_);
            bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar17 * auVar94._24_4_ | (uint)!bVar17 * auVar86._24_4_);
            bVar17 = SUB81(uVar68 >> 7,0);
            auVar116._28_4_ = (uint)bVar17 * auVar94._28_4_ | (uint)!bVar17 * auVar86._28_4_;
            auVar173._8_4_ = 0x80000000;
            auVar173._0_8_ = 0x8000000080000000;
            auVar173._12_4_ = 0x80000000;
            auVar173._16_4_ = 0x80000000;
            auVar173._20_4_ = 0x80000000;
            auVar173._24_4_ = 0x80000000;
            auVar173._28_4_ = 0x80000000;
            auVar91 = vxorps_avx512vl(auVar115,auVar173);
            auVar86 = auVar193._0_32_;
            auVar88 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar86);
            auVar81 = vfmadd231ps_fma(auVar88,auVar114,auVar114);
            auVar88 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
            auVar185._8_4_ = 0xbf000000;
            auVar185._0_8_ = 0xbf000000bf000000;
            auVar185._12_4_ = 0xbf000000;
            auVar185._16_4_ = 0xbf000000;
            auVar185._20_4_ = 0xbf000000;
            auVar185._24_4_ = 0xbf000000;
            auVar185._28_4_ = 0xbf000000;
            fVar150 = auVar88._0_4_;
            fVar133 = auVar88._4_4_;
            fVar134 = auVar88._8_4_;
            fVar140 = auVar88._12_4_;
            fVar164 = auVar88._16_4_;
            fVar166 = auVar88._20_4_;
            fVar77 = auVar88._24_4_;
            auVar49._4_4_ = fVar133 * fVar133 * fVar133 * auVar81._4_4_ * -0.5;
            auVar49._0_4_ = fVar150 * fVar150 * fVar150 * auVar81._0_4_ * -0.5;
            auVar49._8_4_ = fVar134 * fVar134 * fVar134 * auVar81._8_4_ * -0.5;
            auVar49._12_4_ = fVar140 * fVar140 * fVar140 * auVar81._12_4_ * -0.5;
            auVar49._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
            auVar49._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
            auVar49._24_4_ = fVar77 * fVar77 * fVar77 * -0.0;
            auVar49._28_4_ = auVar114._28_4_;
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar88 = vfmadd231ps_avx512vl(auVar49,auVar89,auVar88);
            auVar50._4_4_ = auVar114._4_4_ * auVar88._4_4_;
            auVar50._0_4_ = auVar114._0_4_ * auVar88._0_4_;
            auVar50._8_4_ = auVar114._8_4_ * auVar88._8_4_;
            auVar50._12_4_ = auVar114._12_4_ * auVar88._12_4_;
            auVar50._16_4_ = auVar114._16_4_ * auVar88._16_4_;
            auVar50._20_4_ = auVar114._20_4_ * auVar88._20_4_;
            auVar50._24_4_ = auVar114._24_4_ * auVar88._24_4_;
            auVar50._28_4_ = 0;
            auVar51._4_4_ = auVar88._4_4_ * -auVar113._4_4_;
            auVar51._0_4_ = auVar88._0_4_ * -auVar113._0_4_;
            auVar51._8_4_ = auVar88._8_4_ * -auVar113._8_4_;
            auVar51._12_4_ = auVar88._12_4_ * -auVar113._12_4_;
            auVar51._16_4_ = auVar88._16_4_ * -auVar113._16_4_;
            auVar51._20_4_ = auVar88._20_4_ * -auVar113._20_4_;
            auVar51._24_4_ = auVar88._24_4_ * -auVar113._24_4_;
            auVar51._28_4_ = auVar114._28_4_;
            auVar90 = vmulps_avx512vl(auVar88,auVar86);
            auVar88 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar86);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar116,auVar116);
            auVar100 = vrsqrt14ps_avx512vl(auVar88);
            auVar88 = vmulps_avx512vl(auVar88,auVar185);
            fVar150 = auVar100._0_4_;
            fVar133 = auVar100._4_4_;
            fVar134 = auVar100._8_4_;
            fVar140 = auVar100._12_4_;
            fVar164 = auVar100._16_4_;
            fVar166 = auVar100._20_4_;
            fVar77 = auVar100._24_4_;
            auVar52._4_4_ = fVar133 * fVar133 * fVar133 * auVar88._4_4_;
            auVar52._0_4_ = fVar150 * fVar150 * fVar150 * auVar88._0_4_;
            auVar52._8_4_ = fVar134 * fVar134 * fVar134 * auVar88._8_4_;
            auVar52._12_4_ = fVar140 * fVar140 * fVar140 * auVar88._12_4_;
            auVar52._16_4_ = fVar164 * fVar164 * fVar164 * auVar88._16_4_;
            auVar52._20_4_ = fVar166 * fVar166 * fVar166 * auVar88._20_4_;
            auVar52._24_4_ = fVar77 * fVar77 * fVar77 * auVar88._24_4_;
            auVar52._28_4_ = auVar88._28_4_;
            auVar88 = vfmadd231ps_avx512vl(auVar52,auVar89,auVar100);
            auVar53._4_4_ = auVar116._4_4_ * auVar88._4_4_;
            auVar53._0_4_ = auVar116._0_4_ * auVar88._0_4_;
            auVar53._8_4_ = auVar116._8_4_ * auVar88._8_4_;
            auVar53._12_4_ = auVar116._12_4_ * auVar88._12_4_;
            auVar53._16_4_ = auVar116._16_4_ * auVar88._16_4_;
            auVar53._20_4_ = auVar116._20_4_ * auVar88._20_4_;
            auVar53._24_4_ = auVar116._24_4_ * auVar88._24_4_;
            auVar53._28_4_ = auVar100._28_4_;
            auVar54._4_4_ = auVar88._4_4_ * auVar91._4_4_;
            auVar54._0_4_ = auVar88._0_4_ * auVar91._0_4_;
            auVar54._8_4_ = auVar88._8_4_ * auVar91._8_4_;
            auVar54._12_4_ = auVar88._12_4_ * auVar91._12_4_;
            auVar54._16_4_ = auVar88._16_4_ * auVar91._16_4_;
            auVar54._20_4_ = auVar88._20_4_ * auVar91._20_4_;
            auVar54._24_4_ = auVar88._24_4_ * auVar91._24_4_;
            auVar54._28_4_ = auVar91._28_4_;
            auVar91 = vmulps_avx512vl(auVar88,auVar86);
            auVar81 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar79),auVar87);
            auVar88 = ZEXT1632(auVar79);
            auVar6 = vfmadd213ps_fma(auVar51,auVar88,auVar96);
            auVar89 = vfmadd213ps_avx512vl(auVar90,auVar88,auVar93);
            auVar100 = vfmadd213ps_avx512vl(auVar53,ZEXT1632(auVar80),auVar97);
            auVar10 = vfnmadd213ps_fma(auVar50,auVar88,auVar87);
            auVar99 = ZEXT1632(auVar80);
            auVar192 = vfmadd213ps_fma(auVar54,auVar99,auVar85);
            auVar82 = vfnmadd213ps_fma(auVar51,auVar88,auVar96);
            auVar7 = vfmadd213ps_fma(auVar91,auVar99,auVar92);
            auVar96 = ZEXT1632(auVar79);
            auVar84 = vfnmadd231ps_fma(auVar93,auVar96,auVar90);
            auVar83 = vfnmadd213ps_fma(auVar53,auVar99,auVar97);
            auVar142 = vfnmadd213ps_fma(auVar54,auVar99,auVar85);
            auVar145 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar80),auVar91);
            auVar92 = vsubps_avx512vl(auVar100,ZEXT1632(auVar10));
            auVar91 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar82));
            auVar88 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar84));
            auVar55._4_4_ = auVar91._4_4_ * auVar84._4_4_;
            auVar55._0_4_ = auVar91._0_4_ * auVar84._0_4_;
            auVar55._8_4_ = auVar91._8_4_ * auVar84._8_4_;
            auVar55._12_4_ = auVar91._12_4_ * auVar84._12_4_;
            auVar55._16_4_ = auVar91._16_4_ * 0.0;
            auVar55._20_4_ = auVar91._20_4_ * 0.0;
            auVar55._24_4_ = auVar91._24_4_ * 0.0;
            auVar55._28_4_ = auVar90._28_4_;
            auVar79 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar82),auVar88);
            auVar56._4_4_ = auVar88._4_4_ * auVar10._4_4_;
            auVar56._0_4_ = auVar88._0_4_ * auVar10._0_4_;
            auVar56._8_4_ = auVar88._8_4_ * auVar10._8_4_;
            auVar56._12_4_ = auVar88._12_4_ * auVar10._12_4_;
            auVar56._16_4_ = auVar88._16_4_ * 0.0;
            auVar56._20_4_ = auVar88._20_4_ * 0.0;
            auVar56._24_4_ = auVar88._24_4_ * 0.0;
            auVar56._28_4_ = auVar88._28_4_;
            auVar8 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar84),auVar92);
            auVar57._4_4_ = auVar82._4_4_ * auVar92._4_4_;
            auVar57._0_4_ = auVar82._0_4_ * auVar92._0_4_;
            auVar57._8_4_ = auVar82._8_4_ * auVar92._8_4_;
            auVar57._12_4_ = auVar82._12_4_ * auVar92._12_4_;
            auVar57._16_4_ = auVar92._16_4_ * 0.0;
            auVar57._20_4_ = auVar92._20_4_ * 0.0;
            auVar57._24_4_ = auVar92._24_4_ * 0.0;
            auVar57._28_4_ = auVar92._28_4_;
            auVar9 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar10),auVar91);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar86,ZEXT1632(auVar8));
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar79));
            uVar68 = vcmpps_avx512vl(auVar91,auVar86,2);
            bVar67 = (byte)uVar68;
            fVar149 = (float)((uint)(bVar67 & 1) * auVar81._0_4_ |
                             (uint)!(bool)(bVar67 & 1) * auVar83._0_4_);
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            fVar127 = (float)((uint)bVar17 * auVar81._4_4_ | (uint)!bVar17 * auVar83._4_4_);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            fVar130 = (float)((uint)bVar17 * auVar81._8_4_ | (uint)!bVar17 * auVar83._8_4_);
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            fVar131 = (float)((uint)bVar17 * auVar81._12_4_ | (uint)!bVar17 * auVar83._12_4_);
            auVar99 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar130,CONCAT44(fVar127,fVar149))));
            fVar126 = (float)((uint)(bVar67 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar67 & 1) * auVar142._0_4_);
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            fVar129 = (float)((uint)bVar17 * auVar6._4_4_ | (uint)!bVar17 * auVar142._4_4_);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            fVar128 = (float)((uint)bVar17 * auVar6._8_4_ | (uint)!bVar17 * auVar142._8_4_);
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            fVar132 = (float)((uint)bVar17 * auVar6._12_4_ | (uint)!bVar17 * auVar142._12_4_);
            auVar95 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar128,CONCAT44(fVar129,fVar126))));
            auVar117._0_4_ =
                 (float)((uint)(bVar67 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar145._0_4_);
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar17 * auVar89._4_4_ | (uint)!bVar17 * auVar145._4_4_);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar17 * auVar89._8_4_ | (uint)!bVar17 * auVar145._8_4_);
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar17 * auVar89._12_4_ | (uint)!bVar17 * auVar145._12_4_);
            fVar134 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar89._16_4_);
            auVar117._16_4_ = fVar134;
            fVar150 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar89._20_4_);
            auVar117._20_4_ = fVar150;
            fVar133 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar89._24_4_);
            auVar117._24_4_ = fVar133;
            iVar1 = (uint)(byte)(uVar68 >> 7) * auVar89._28_4_;
            auVar117._28_4_ = iVar1;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar100);
            auVar118._0_4_ =
                 (uint)(bVar67 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar79._0_4_;
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * auVar79._4_4_;
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * auVar79._8_4_;
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * auVar79._12_4_;
            auVar118._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar91._16_4_;
            auVar118._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar91._20_4_;
            auVar118._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar91._24_4_;
            auVar118._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar91._28_4_;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar192));
            auVar119._0_4_ =
                 (float)((uint)(bVar67 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar81._0_4_);
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * auVar81._4_4_);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * auVar81._8_4_);
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * auVar81._12_4_);
            fVar166 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar91._16_4_);
            auVar119._16_4_ = fVar166;
            fVar164 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar91._20_4_);
            auVar119._20_4_ = fVar164;
            fVar140 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar91._24_4_);
            auVar119._24_4_ = fVar140;
            auVar119._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar91._28_4_;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar7));
            auVar120._0_4_ =
                 (float)((uint)(bVar67 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar6._0_4_);
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * auVar6._4_4_);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * auVar6._8_4_);
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar120._12_4_ = (float)((uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * auVar6._12_4_)
            ;
            fVar125 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar91._16_4_);
            auVar120._16_4_ = fVar125;
            fVar78 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar91._20_4_);
            auVar120._20_4_ = fVar78;
            fVar77 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar91._24_4_);
            auVar120._24_4_ = fVar77;
            iVar2 = (uint)(byte)(uVar68 >> 7) * auVar91._28_4_;
            auVar120._28_4_ = iVar2;
            auVar121._0_4_ =
                 (uint)(bVar67 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar67 & 1) * auVar100._0_4_;
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar17 * (int)auVar10._4_4_ | (uint)!bVar17 * auVar100._4_4_;
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar17 * (int)auVar10._8_4_ | (uint)!bVar17 * auVar100._8_4_;
            bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar17 * (int)auVar10._12_4_ | (uint)!bVar17 * auVar100._12_4_;
            auVar121._16_4_ = (uint)!(bool)((byte)(uVar68 >> 4) & 1) * auVar100._16_4_;
            auVar121._20_4_ = (uint)!(bool)((byte)(uVar68 >> 5) & 1) * auVar100._20_4_;
            auVar121._24_4_ = (uint)!(bool)((byte)(uVar68 >> 6) & 1) * auVar100._24_4_;
            auVar121._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar100._28_4_;
            bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar68 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar68 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar68 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar68 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar100 = vsubps_avx512vl(auVar121,auVar99);
            auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar82._12_4_ |
                                                    (uint)!bVar21 * auVar192._12_4_,
                                                    CONCAT48((uint)bVar19 * (int)auVar82._8_4_ |
                                                             (uint)!bVar19 * auVar192._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar82._4_4_ |
                                                                      (uint)!bVar17 * auVar192._4_4_
                                                                      ,(uint)(bVar67 & 1) *
                                                                       (int)auVar82._0_4_ |
                                                                       (uint)!(bool)(bVar67 & 1) *
                                                                       auVar192._0_4_)))),auVar95);
            auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar84._12_4_ |
                                                    (uint)!bVar22 * auVar7._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar84._8_4_ |
                                                             (uint)!bVar20 * auVar7._8_4_,
                                                             CONCAT44((uint)bVar18 *
                                                                      (int)auVar84._4_4_ |
                                                                      (uint)!bVar18 * auVar7._4_4_,
                                                                      (uint)(bVar67 & 1) *
                                                                      (int)auVar84._0_4_ |
                                                                      (uint)!(bool)(bVar67 & 1) *
                                                                      auVar7._0_4_)))),auVar117);
            auVar90 = vsubps_avx(auVar99,auVar118);
            auVar92 = vsubps_avx(auVar95,auVar119);
            auVar93 = vsubps_avx(auVar117,auVar120);
            auVar58._4_4_ = auVar89._4_4_ * fVar127;
            auVar58._0_4_ = auVar89._0_4_ * fVar149;
            auVar58._8_4_ = auVar89._8_4_ * fVar130;
            auVar58._12_4_ = auVar89._12_4_ * fVar131;
            auVar58._16_4_ = auVar89._16_4_ * 0.0;
            auVar58._20_4_ = auVar89._20_4_ * 0.0;
            auVar58._24_4_ = auVar89._24_4_ * 0.0;
            auVar58._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar58,auVar117,auVar100);
            auVar156._0_4_ = fVar126 * auVar100._0_4_;
            auVar156._4_4_ = fVar129 * auVar100._4_4_;
            auVar156._8_4_ = fVar128 * auVar100._8_4_;
            auVar156._12_4_ = fVar132 * auVar100._12_4_;
            auVar156._16_4_ = auVar100._16_4_ * 0.0;
            auVar156._20_4_ = auVar100._20_4_ * 0.0;
            auVar156._24_4_ = auVar100._24_4_ * 0.0;
            auVar156._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar156,auVar99,auVar88);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar86,ZEXT1632(auVar79));
            auVar159._0_4_ = auVar88._0_4_ * auVar117._0_4_;
            auVar159._4_4_ = auVar88._4_4_ * auVar117._4_4_;
            auVar159._8_4_ = auVar88._8_4_ * auVar117._8_4_;
            auVar159._12_4_ = auVar88._12_4_ * auVar117._12_4_;
            auVar159._16_4_ = auVar88._16_4_ * fVar134;
            auVar159._20_4_ = auVar88._20_4_ * fVar150;
            auVar159._24_4_ = auVar88._24_4_ * fVar133;
            auVar159._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar159,auVar95,auVar89);
            auVar94 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar79));
            auVar91 = vmulps_avx512vl(auVar93,auVar118);
            auVar91 = vfmsub231ps_avx512vl(auVar91,auVar90,auVar120);
            auVar59._4_4_ = auVar92._4_4_ * auVar120._4_4_;
            auVar59._0_4_ = auVar92._0_4_ * auVar120._0_4_;
            auVar59._8_4_ = auVar92._8_4_ * auVar120._8_4_;
            auVar59._12_4_ = auVar92._12_4_ * auVar120._12_4_;
            auVar59._16_4_ = auVar92._16_4_ * fVar125;
            auVar59._20_4_ = auVar92._20_4_ * fVar78;
            auVar59._24_4_ = auVar92._24_4_ * fVar77;
            auVar59._28_4_ = iVar2;
            auVar79 = vfmsub231ps_fma(auVar59,auVar119,auVar93);
            auVar160._0_4_ = auVar119._0_4_ * auVar90._0_4_;
            auVar160._4_4_ = auVar119._4_4_ * auVar90._4_4_;
            auVar160._8_4_ = auVar119._8_4_ * auVar90._8_4_;
            auVar160._12_4_ = auVar119._12_4_ * auVar90._12_4_;
            auVar160._16_4_ = fVar166 * auVar90._16_4_;
            auVar160._20_4_ = fVar164 * auVar90._20_4_;
            auVar160._24_4_ = fVar140 * auVar90._24_4_;
            auVar160._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar160,auVar92,auVar118);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar86,auVar91);
            auVar87 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar79));
            auVar91 = vmaxps_avx(auVar94,auVar87);
            uVar141 = vcmpps_avx512vl(auVar91,auVar86,2);
            bVar76 = bVar76 & (byte)uVar141;
            if (bVar76 != 0) {
              uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar180._4_4_ = uVar135;
              auVar180._0_4_ = uVar135;
              auVar180._8_4_ = uVar135;
              auVar180._12_4_ = uVar135;
              auVar180._16_4_ = uVar135;
              auVar180._20_4_ = uVar135;
              auVar180._24_4_ = uVar135;
              auVar180._28_4_ = uVar135;
              auVar181 = ZEXT3264(auVar180);
              auVar60._4_4_ = auVar93._4_4_ * auVar88._4_4_;
              auVar60._0_4_ = auVar93._0_4_ * auVar88._0_4_;
              auVar60._8_4_ = auVar93._8_4_ * auVar88._8_4_;
              auVar60._12_4_ = auVar93._12_4_ * auVar88._12_4_;
              auVar60._16_4_ = auVar93._16_4_ * auVar88._16_4_;
              auVar60._20_4_ = auVar93._20_4_ * auVar88._20_4_;
              auVar60._24_4_ = auVar93._24_4_ * auVar88._24_4_;
              auVar60._28_4_ = auVar91._28_4_;
              auVar6 = vfmsub231ps_fma(auVar60,auVar92,auVar89);
              auVar61._4_4_ = auVar89._4_4_ * auVar90._4_4_;
              auVar61._0_4_ = auVar89._0_4_ * auVar90._0_4_;
              auVar61._8_4_ = auVar89._8_4_ * auVar90._8_4_;
              auVar61._12_4_ = auVar89._12_4_ * auVar90._12_4_;
              auVar61._16_4_ = auVar89._16_4_ * auVar90._16_4_;
              auVar61._20_4_ = auVar89._20_4_ * auVar90._20_4_;
              auVar61._24_4_ = auVar89._24_4_ * auVar90._24_4_;
              auVar61._28_4_ = auVar89._28_4_;
              auVar81 = vfmsub231ps_fma(auVar61,auVar100,auVar93);
              auVar62._4_4_ = auVar92._4_4_ * auVar100._4_4_;
              auVar62._0_4_ = auVar92._0_4_ * auVar100._0_4_;
              auVar62._8_4_ = auVar92._8_4_ * auVar100._8_4_;
              auVar62._12_4_ = auVar92._12_4_ * auVar100._12_4_;
              auVar62._16_4_ = auVar92._16_4_ * auVar100._16_4_;
              auVar62._20_4_ = auVar92._20_4_ * auVar100._20_4_;
              auVar62._24_4_ = auVar92._24_4_ * auVar100._24_4_;
              auVar62._28_4_ = auVar92._28_4_;
              auVar192 = vfmsub231ps_fma(auVar62,auVar90,auVar88);
              auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar192));
              auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar6),auVar86);
              auVar88 = vrcp14ps_avx512vl(auVar91);
              auVar90 = auVar194._0_32_;
              auVar89 = vfnmadd213ps_avx512vl(auVar88,auVar91,auVar90);
              auVar79 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
              auVar63._4_4_ = auVar192._4_4_ * auVar117._4_4_;
              auVar63._0_4_ = auVar192._0_4_ * auVar117._0_4_;
              auVar63._8_4_ = auVar192._8_4_ * auVar117._8_4_;
              auVar63._12_4_ = auVar192._12_4_ * auVar117._12_4_;
              auVar63._16_4_ = fVar134 * 0.0;
              auVar63._20_4_ = fVar150 * 0.0;
              auVar63._24_4_ = fVar133 * 0.0;
              auVar63._28_4_ = iVar1;
              auVar81 = vfmadd231ps_fma(auVar63,auVar95,ZEXT1632(auVar81));
              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar99,ZEXT1632(auVar6));
              fVar150 = auVar79._0_4_;
              fVar133 = auVar79._4_4_;
              fVar134 = auVar79._8_4_;
              fVar140 = auVar79._12_4_;
              local_600 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar140,
                                             CONCAT48(auVar81._8_4_ * fVar134,
                                                      CONCAT44(auVar81._4_4_ * fVar133,
                                                               auVar81._0_4_ * fVar150))));
              uVar141 = vcmpps_avx512vl(local_600,auVar180,2);
              auVar65._4_4_ = uStack_6dc;
              auVar65._0_4_ = local_6e0;
              auVar65._8_4_ = uStack_6d8;
              auVar65._12_4_ = uStack_6d4;
              auVar65._16_4_ = uStack_6d0;
              auVar65._20_4_ = uStack_6cc;
              auVar65._24_4_ = uStack_6c8;
              auVar65._28_4_ = uStack_6c4;
              uVar23 = vcmpps_avx512vl(local_600,auVar65,0xd);
              bVar76 = (byte)uVar141 & (byte)uVar23 & bVar76;
              if (bVar76 != 0) {
                uVar141 = vcmpps_avx512vl(auVar91,auVar86,4);
                bVar76 = bVar76 & (byte)uVar141;
                auVar188 = ZEXT3264(local_8c0);
                auVar187 = ZEXT3264(local_8e0);
                if (bVar76 != 0) {
                  fVar164 = auVar94._0_4_ * fVar150;
                  fVar166 = auVar94._4_4_ * fVar133;
                  auVar64._4_4_ = fVar166;
                  auVar64._0_4_ = fVar164;
                  fVar77 = auVar94._8_4_ * fVar134;
                  auVar64._8_4_ = fVar77;
                  fVar78 = auVar94._12_4_ * fVar140;
                  auVar64._12_4_ = fVar78;
                  fVar125 = auVar94._16_4_ * 0.0;
                  auVar64._16_4_ = fVar125;
                  fVar149 = auVar94._20_4_ * 0.0;
                  auVar64._20_4_ = fVar149;
                  fVar126 = auVar94._24_4_ * 0.0;
                  auVar64._24_4_ = fVar126;
                  auVar64._28_4_ = auVar91._28_4_;
                  auVar88 = vsubps_avx512vl(auVar90,auVar64);
                  local_640._0_4_ =
                       (float)((uint)(bVar67 & 1) * (int)fVar164 |
                              (uint)!(bool)(bVar67 & 1) * auVar88._0_4_);
                  bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
                  local_640._4_4_ =
                       (float)((uint)bVar17 * (int)fVar166 | (uint)!bVar17 * auVar88._4_4_);
                  bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
                  local_640._8_4_ =
                       (float)((uint)bVar17 * (int)fVar77 | (uint)!bVar17 * auVar88._8_4_);
                  bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
                  local_640._12_4_ =
                       (float)((uint)bVar17 * (int)fVar78 | (uint)!bVar17 * auVar88._12_4_);
                  bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
                  local_640._16_4_ =
                       (float)((uint)bVar17 * (int)fVar125 | (uint)!bVar17 * auVar88._16_4_);
                  bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
                  local_640._20_4_ =
                       (float)((uint)bVar17 * (int)fVar149 | (uint)!bVar17 * auVar88._20_4_);
                  bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
                  local_640._24_4_ =
                       (float)((uint)bVar17 * (int)fVar126 | (uint)!bVar17 * auVar88._24_4_);
                  bVar17 = SUB81(uVar68 >> 7,0);
                  local_640._28_4_ =
                       (float)((uint)bVar17 * auVar91._28_4_ | (uint)!bVar17 * auVar88._28_4_);
                  auVar91 = vsubps_avx(ZEXT1632(auVar80),auVar96);
                  auVar79 = vfmadd213ps_fma(auVar91,local_640,auVar96);
                  uVar135 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                  auVar28._4_4_ = uVar135;
                  auVar28._0_4_ = uVar135;
                  auVar28._8_4_ = uVar135;
                  auVar28._12_4_ = uVar135;
                  auVar28._16_4_ = uVar135;
                  auVar28._20_4_ = uVar135;
                  auVar28._24_4_ = uVar135;
                  auVar28._28_4_ = uVar135;
                  auVar91 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                               CONCAT48(auVar79._8_4_ +
                                                                        auVar79._8_4_,
                                                                        CONCAT44(auVar79._4_4_ +
                                                                                 auVar79._4_4_,
                                                                                 auVar79._0_4_ +
                                                                                 auVar79._0_4_)))),
                                            auVar28);
                  uVar141 = vcmpps_avx512vl(local_600,auVar91,6);
                  if (((byte)uVar141 & bVar76) != 0) {
                    auVar144._0_4_ = auVar87._0_4_ * fVar150;
                    auVar144._4_4_ = auVar87._4_4_ * fVar133;
                    auVar144._8_4_ = auVar87._8_4_ * fVar134;
                    auVar144._12_4_ = auVar87._12_4_ * fVar140;
                    auVar144._16_4_ = auVar87._16_4_ * 0.0;
                    auVar144._20_4_ = auVar87._20_4_ * 0.0;
                    auVar144._24_4_ = auVar87._24_4_ * 0.0;
                    auVar144._28_4_ = 0;
                    auVar91 = vsubps_avx512vl(auVar90,auVar144);
                    auVar122._0_4_ =
                         (uint)(bVar67 & 1) * (int)auVar144._0_4_ |
                         (uint)!(bool)(bVar67 & 1) * auVar91._0_4_;
                    bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
                    auVar122._4_4_ =
                         (uint)bVar17 * (int)auVar144._4_4_ | (uint)!bVar17 * auVar91._4_4_;
                    bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
                    auVar122._8_4_ =
                         (uint)bVar17 * (int)auVar144._8_4_ | (uint)!bVar17 * auVar91._8_4_;
                    bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
                    auVar122._12_4_ =
                         (uint)bVar17 * (int)auVar144._12_4_ | (uint)!bVar17 * auVar91._12_4_;
                    bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
                    auVar122._16_4_ =
                         (uint)bVar17 * (int)auVar144._16_4_ | (uint)!bVar17 * auVar91._16_4_;
                    bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
                    auVar122._20_4_ =
                         (uint)bVar17 * (int)auVar144._20_4_ | (uint)!bVar17 * auVar91._20_4_;
                    bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
                    auVar122._24_4_ =
                         (uint)bVar17 * (int)auVar144._24_4_ | (uint)!bVar17 * auVar91._24_4_;
                    auVar122._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar91._28_4_;
                    auVar29._8_4_ = 0x40000000;
                    auVar29._0_8_ = 0x4000000040000000;
                    auVar29._12_4_ = 0x40000000;
                    auVar29._16_4_ = 0x40000000;
                    auVar29._20_4_ = 0x40000000;
                    auVar29._24_4_ = 0x40000000;
                    auVar29._28_4_ = 0x40000000;
                    local_620 = vfmsub132ps_avx512vl(auVar122,auVar90,auVar29);
                    local_5e0 = (undefined4)lVar75;
                    local_5d0 = local_870._0_8_;
                    uStack_5c8 = local_870._8_8_;
                    local_5c0 = local_880._0_8_;
                    uStack_5b8 = local_880._8_8_;
                    local_5b0 = local_890._0_8_;
                    uStack_5a8 = local_890._8_8_;
                    pGVar14 = (context->scene->geometries).items[uVar12].ptr;
                    if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar67 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar67 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar79 = vcvtsi2ss_avx512f(auVar98._0_16_,local_5e0);
                      fVar150 = auVar79._0_4_;
                      local_580[0] = (fVar150 + local_640._0_4_ + 0.0) * (float)local_700;
                      local_580[1] = (fVar150 + local_640._4_4_ + 1.0) * local_700._4_4_;
                      local_580[2] = (fVar150 + local_640._8_4_ + 2.0) * fStack_6f8;
                      local_580[3] = (fVar150 + local_640._12_4_ + 3.0) * fStack_6f4;
                      fStack_570 = (fVar150 + local_640._16_4_ + 4.0) * fStack_6f0;
                      fStack_56c = (fVar150 + local_640._20_4_ + 5.0) * fStack_6ec;
                      fStack_568 = (fVar150 + local_640._24_4_ + 6.0) * fStack_6e8;
                      fStack_564 = fVar150 + local_640._28_4_ + 7.0;
                      local_560 = local_620;
                      local_540 = local_600;
                      lVar69 = 0;
                      uVar73 = (ulong)((byte)uVar141 & bVar76);
                      for (uVar68 = uVar73; (uVar68 & 1) == 0;
                          uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                        lVar69 = lVar69 + 1;
                      }
                      local_760._0_4_ = (int)uVar72;
                      local_520 = auVar180;
                      local_5dc = iVar13;
                      do {
                        auVar192 = auVar193._0_16_;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[lVar69]));
                        local_440._0_8_ = lVar69;
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + lVar69 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_540 + lVar69 * 4);
                        local_910.context = context->user;
                        fVar133 = local_200._0_4_;
                        fVar150 = 1.0 - fVar133;
                        auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar133 * (fVar150 + fVar150))),
                                                  ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                        auVar81 = local_200._0_16_;
                        auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar81,
                                                  ZEXT416(0xc0a00000));
                        auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133 * 3.0)),
                                                  ZEXT416((uint)(fVar133 + fVar133)),auVar79);
                        auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar81,
                                                  ZEXT416(0x40000000));
                        auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                                  ZEXT416((uint)(fVar150 + fVar150)),auVar79);
                        auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),auVar81,
                                                  ZEXT416((uint)(fVar150 * -2.0)));
                        fVar150 = auVar6._0_4_ * 0.5;
                        fVar133 = auVar80._0_4_ * 0.5;
                        fVar134 = auVar79._0_4_ * 0.5;
                        fVar140 = auVar81._0_4_ * 0.5;
                        auVar153._0_4_ = fVar140 * (float)local_710._0_4_;
                        auVar153._4_4_ = fVar140 * (float)local_710._4_4_;
                        auVar153._8_4_ = fVar140 * fStack_708;
                        auVar153._12_4_ = fVar140 * fStack_704;
                        auVar162._4_4_ = fVar134;
                        auVar162._0_4_ = fVar134;
                        auVar162._8_4_ = fVar134;
                        auVar162._12_4_ = fVar134;
                        auVar79 = vfmadd132ps_fma(auVar162,auVar153,local_890);
                        auVar154._4_4_ = fVar133;
                        auVar154._0_4_ = fVar133;
                        auVar154._8_4_ = fVar133;
                        auVar154._12_4_ = fVar133;
                        auVar79 = vfmadd132ps_fma(auVar154,auVar79,local_880);
                        auVar137._4_4_ = fVar150;
                        auVar137._0_4_ = fVar150;
                        auVar137._8_4_ = fVar150;
                        auVar137._12_4_ = fVar150;
                        auVar79 = vfmadd132ps_fma(auVar137,auVar79,local_870);
                        auVar139 = vbroadcastss_avx512f(auVar79);
                        auVar195 = vbroadcastss_avx512f(ZEXT416(1));
                        local_280 = vpermps_avx512f(auVar195,ZEXT1664(auVar79));
                        auVar195 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar195,ZEXT1664(auVar79));
                        local_2c0[0] = (RTCHitN)auVar139[0];
                        local_2c0[1] = (RTCHitN)auVar139[1];
                        local_2c0[2] = (RTCHitN)auVar139[2];
                        local_2c0[3] = (RTCHitN)auVar139[3];
                        local_2c0[4] = (RTCHitN)auVar139[4];
                        local_2c0[5] = (RTCHitN)auVar139[5];
                        local_2c0[6] = (RTCHitN)auVar139[6];
                        local_2c0[7] = (RTCHitN)auVar139[7];
                        local_2c0[8] = (RTCHitN)auVar139[8];
                        local_2c0[9] = (RTCHitN)auVar139[9];
                        local_2c0[10] = (RTCHitN)auVar139[10];
                        local_2c0[0xb] = (RTCHitN)auVar139[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar139[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar139[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar139[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar139[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar139[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar139[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar139[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar139[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar139[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar139[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar139[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar139[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar139[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar139[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar139[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar139[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar139[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar139[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar139[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar139[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar139[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar139[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar139[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar139[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar139[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar139[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar139[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar139[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar139[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar139[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar139[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar139[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar139[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar139[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar139[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar139[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar139[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar139[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar139[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar139[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar139[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar139[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar139[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar139[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar139[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar139[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar139[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar139[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar139[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar139[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar139[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar139[0x3f];
                        local_180 = local_480._0_8_;
                        uStack_178 = local_480._8_8_;
                        uStack_170 = local_480._16_8_;
                        uStack_168 = local_480._24_8_;
                        uStack_160 = local_480._32_8_;
                        uStack_158 = local_480._40_8_;
                        uStack_150 = local_480._48_8_;
                        uStack_148 = local_480._56_8_;
                        auVar139 = vmovdqa64_avx512f(local_4c0);
                        local_140 = vmovdqa64_avx512f(auVar139);
                        vpcmpeqd_avx2(auVar139._0_32_,auVar139._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]))
                        ;
                        auVar139 = vmovdqa64_avx512f(local_300);
                        local_6c0 = vmovdqa64_avx512f(auVar139);
                        local_910.valid = (int *)local_6c0;
                        local_910.geometryUserPtr = pGVar14->userPtr;
                        local_910.hit = local_2c0;
                        local_910.N = 0x10;
                        local_500._0_8_ = uVar73;
                        local_910.ray = (RTCRayN *)ray;
                        if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar14->occlusionFilterN)(&local_910);
                          auVar181 = ZEXT3264(local_520);
                          uVar72 = (ulong)(uint)local_760._0_4_;
                          auVar187 = ZEXT3264(local_8e0);
                          auVar188 = ZEXT3264(local_8c0);
                          auVar191 = ZEXT3264(local_7a0);
                          auVar190 = ZEXT3264(local_740);
                          auVar189 = ZEXT3264(local_780);
                          auVar79 = vxorps_avx512vl(auVar192,auVar192);
                          auVar193 = ZEXT1664(auVar79);
                          auVar139 = vmovdqa64_avx512f(local_6c0);
                          uVar73 = local_500._0_8_;
                        }
                        auVar79 = auVar193._0_16_;
                        uVar141 = vptestmd_avx512f(auVar139,auVar139);
                        if ((short)uVar141 == 0) {
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar194 = ZEXT3264(auVar91);
                          auVar139 = ZEXT3264(local_860);
                          auVar195 = ZEXT3264(local_820);
                          auVar196 = ZEXT3264(local_840);
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var16)(&local_910);
                            auVar181 = ZEXT3264(local_520);
                            uVar72 = (ulong)(uint)local_760._0_4_;
                            auVar187 = ZEXT3264(local_8e0);
                            auVar188 = ZEXT3264(local_8c0);
                            auVar191 = ZEXT3264(local_7a0);
                            auVar190 = ZEXT3264(local_740);
                            auVar189 = ZEXT3264(local_780);
                            auVar79 = vxorps_avx512vl(auVar79,auVar79);
                            auVar193 = ZEXT1664(auVar79);
                            auVar139 = vmovdqa64_avx512f(local_6c0);
                            uVar73 = local_500._0_8_;
                          }
                          uVar68 = vptestmd_avx512f(auVar139,auVar139);
                          auVar195 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar17 = (bool)((byte)uVar68 & 1);
                          auVar139._0_4_ =
                               (uint)bVar17 * auVar195._0_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x200);
                          bVar17 = (bool)((byte)(uVar68 >> 1) & 1);
                          auVar139._4_4_ =
                               (uint)bVar17 * auVar195._4_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x204);
                          bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
                          auVar139._8_4_ =
                               (uint)bVar17 * auVar195._8_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x208);
                          bVar17 = (bool)((byte)(uVar68 >> 3) & 1);
                          auVar139._12_4_ =
                               (uint)bVar17 * auVar195._12_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x20c);
                          bVar17 = (bool)((byte)(uVar68 >> 4) & 1);
                          auVar139._16_4_ =
                               (uint)bVar17 * auVar195._16_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x210);
                          bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
                          auVar139._20_4_ =
                               (uint)bVar17 * auVar195._20_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x214);
                          bVar17 = (bool)((byte)(uVar68 >> 6) & 1);
                          auVar139._24_4_ =
                               (uint)bVar17 * auVar195._24_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x218);
                          bVar17 = (bool)((byte)(uVar68 >> 7) & 1);
                          auVar139._28_4_ =
                               (uint)bVar17 * auVar195._28_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x21c);
                          bVar17 = (bool)((byte)(uVar68 >> 8) & 1);
                          auVar139._32_4_ =
                               (uint)bVar17 * auVar195._32_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x220);
                          bVar17 = (bool)((byte)(uVar68 >> 9) & 1);
                          auVar139._36_4_ =
                               (uint)bVar17 * auVar195._36_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x224);
                          bVar17 = (bool)((byte)(uVar68 >> 10) & 1);
                          auVar139._40_4_ =
                               (uint)bVar17 * auVar195._40_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x228);
                          bVar17 = (bool)((byte)(uVar68 >> 0xb) & 1);
                          auVar139._44_4_ =
                               (uint)bVar17 * auVar195._44_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x22c);
                          bVar17 = (bool)((byte)(uVar68 >> 0xc) & 1);
                          auVar139._48_4_ =
                               (uint)bVar17 * auVar195._48_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x230);
                          bVar17 = (bool)((byte)(uVar68 >> 0xd) & 1);
                          auVar139._52_4_ =
                               (uint)bVar17 * auVar195._52_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x234);
                          bVar17 = (bool)((byte)(uVar68 >> 0xe) & 1);
                          auVar139._56_4_ =
                               (uint)bVar17 * auVar195._56_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x238);
                          bVar17 = SUB81(uVar68 >> 0xf,0);
                          auVar139._60_4_ =
                               (uint)bVar17 * auVar195._60_4_ |
                               (uint)!bVar17 * *(int *)(local_910.ray + 0x23c);
                          *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar139;
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar194 = ZEXT3264(auVar91);
                          auVar139 = ZEXT3264(local_860);
                          auVar195 = ZEXT3264(local_820);
                          auVar196 = ZEXT3264(local_840);
                          if ((short)uVar68 != 0) {
                            bVar67 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x200) = auVar181._0_4_;
                        bVar67 = 0;
                        lVar69 = 0;
                        uVar73 = uVar73 ^ 1L << (local_440._0_8_ & 0x3f);
                        for (uVar68 = uVar73; (uVar68 & 1) == 0;
                            uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                          lVar69 = lVar69 + 1;
                        }
                      } while (uVar73 != 0);
                    }
                    uVar72 = CONCAT71((int7)(uVar72 >> 8),(byte)uVar72 | bVar67);
                  }
                }
                goto LAB_01e8afdf;
              }
            }
            auVar188 = ZEXT3264(local_8c0);
            auVar187 = ZEXT3264(local_8e0);
          }
LAB_01e8afdf:
          lVar75 = lVar75 + 8;
        } while ((int)lVar75 < iVar13);
      }
      bVar76 = (byte)uVar72;
      if ((uVar72 & 1) != 0) break;
      uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar27._4_4_ = uVar135;
      auVar27._0_4_ = uVar135;
      auVar27._8_4_ = uVar135;
      auVar27._12_4_ = uVar135;
      auVar27._16_4_ = uVar135;
      auVar27._20_4_ = uVar135;
      auVar27._24_4_ = uVar135;
      auVar27._28_4_ = uVar135;
      uVar141 = vcmpps_avx512vl(local_320,auVar27,2);
      uVar74 = (uint)uVar70 & (uint)uVar70 + 0xff & (uint)uVar141;
      uVar70 = (ulong)uVar74;
    } while (uVar74 != 0);
  }
  return (bool)(bVar76 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }